

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::compRHS
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhs,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *rhnd,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_rhcc)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  pointer paVar13;
  Geometry *pGVar14;
  FabArray<amrex::FArrayBox> *pFVar15;
  pointer ppMVar16;
  MultiFab *pMVar17;
  FabArray<amrex::IArrayBox> *pFVar18;
  long *plVar19;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  EBCellFlagFab *this_02;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> this_03;
  pointer paVar20;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_04;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_05;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  _Var21;
  pointer ppMVar22;
  int iVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  MultiFab *pMVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> uVar29;
  bool bVar30;
  int idim;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  EBFArrayBoxFactory *this_06;
  int *piVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  int ilev_2;
  int iVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  int iVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  double *pdVar66;
  int iVar67;
  int iVar68;
  size_type __n;
  long lVar69;
  long lVar70;
  long lVar71;
  Real RVar72;
  EBFArrayBoxFactory *this_07;
  ulong uVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  int iVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  double *pdVar85;
  double *pdVar86;
  int iVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  int iVar91;
  long lVar92;
  long lVar93;
  int joff;
  long lVar94;
  long lVar95;
  long lVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  undefined8 *puVar100;
  long lVar101;
  int in;
  int iVar102;
  long lVar103;
  void *pvVar104;
  long lVar105;
  int iVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  bool bVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  Periodicity PVar141;
  Real facy_2;
  double local_858;
  long local_850;
  int local_848;
  Real facx;
  ulong local_820;
  Real facx_2;
  int local_7ec;
  Real facz_2;
  Box domain;
  undefined4 uStack_79c;
  uint local_798;
  uint local_794;
  uint local_790;
  Box cccdom_pi;
  Real facz_4;
  ulong local_748;
  Real facy_4;
  Real facx_4;
  Box bx;
  Array4<const_double> local_648;
  double local_608;
  undefined8 uStack_600;
  double local_5f8;
  undefined8 uStack_5f0;
  ulong local_5e0;
  long local_5d8;
  ulong local_5d0;
  Box result_1;
  undefined4 uStack_5ac;
  uint local_5a8;
  int local_5a4;
  int local_5a0;
  Box bx_2;
  undefined4 uStack_55c;
  Dim3 local_558 [2];
  GpuArray<amrex::LinOpBCType,_3U> local_538;
  GpuArray<amrex::LinOpBCType,_3U> local_528;
  Real facz;
  undefined8 uStack_510;
  Real facy;
  undefined8 uStack_500;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4f0;
  IntVect dlo;
  int aiStack_4dc [3];
  IndexType IStack_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  long local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  undefined4 local_484;
  MFIter mfi_3;
  FabType local_400;
  int local_3fc;
  IntVect dhi;
  undefined4 uStack_3ec;
  long local_3e8;
  long local_3e0;
  int local_3d8;
  uint local_3d4;
  uint local_3d0;
  Box result;
  FabArray<amrex::FArrayBox> *local_398;
  IntVect cell;
  int iStack_374;
  int local_370;
  int iStack_36c;
  int local_360;
  int local_35c;
  int local_358;
  MultiCutFab *local_340;
  FabArray<amrex::EBCellFlagFab> *local_330;
  Box local_2e4;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  MFItInfo local_28c;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  frhs;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhs_cc;
  MFIter mfi;
  
  if ((this->super_MLNodeLinOp).m_masks_built == false) {
    MLNodeLinOp::buildMasks(&this->super_MLNodeLinOp);
  }
  if (this->m_integral_built == false) {
    buildIntegral(this);
  }
  if ((this->m_build_surface_integral == true) && (this->m_surface_integral_built == false)) {
    buildSurfaceIntegral(this);
  }
  paVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_528.arr._0_8_ = *(undefined8 *)paVar13->_M_elems;
  local_528.arr[2] = paVar13->_M_elems[2];
  paVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_538.arr._0_8_ = *(undefined8 *)paVar13->_M_elems;
  local_538.arr[2] = paVar13->_M_elems[2];
  bVar112 = false;
  for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
    bVar30 = !bVar112;
    bVar112 = true;
    if ((bVar30) && (local_528.arr[lVar38] != inflow)) {
      bVar112 = local_538.arr[lVar38] == inflow;
    }
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&rhcc.
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,(allocator_type *)&mfi);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&rhs_cc.
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,(allocator_type *)&mfi);
  uVar73 = 0;
  local_4f0 = rhs;
  do {
    __n = (size_type)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    if ((long)__n <= (long)uVar73) {
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::vector(&frhs.
                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ,__n,(allocator_type *)&mfi);
      lVar38 = 0;
      while (uVar73 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
            lVar38 < (long)(uVar73 - 1)) {
        iVar32 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar38];
        lVar107 = lVar38 + 1;
        lVar103 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar107].
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        if ((iVar32 != 2) && (iVar32 != 4)) {
          Assert_host("amrrr == 2 || amrrr == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                      ,0x454,(char *)0x0);
        }
        amrex::coarsen((BoxArray *)&mfi,
                       (BoxArray *)
                       ((long)&((rhs->
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                                .
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar107]->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),iVar32);
        domain.smallend.vect[0] = 1;
        local_648.p._0_4_ = 0;
        std::make_unique<amrex::MultiFab,amrex::BoxArray,amrex::DistributionMapping_const&,int,int>
                  ((BoxArray *)&mfi_3,(DistributionMapping *)&mfi,
                   (int *)((long)&((rhs->
                                   super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                   ).
                                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar107]->
                                  super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x70),
                   (int *)&domain);
        pMVar26 = (MultiFab *)
                  CONCAT44(mfi_3.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                           (int)mfi_3.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
        pMVar17 = frhs.
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar38]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        frhs.
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar38]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar26;
        if (pMVar17 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
        if ((long *)CONCAT44(mfi_3.m_fa._M_t.
                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_
                             ,(int)mfi_3.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                            ) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(mfi_3.m_fa._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl._4_4_,
                                         (int)mfi_3.m_fa._M_t.
                                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                              _M_head_impl) + 8))();
        }
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
        BoxArray::~BoxArray((BoxArray *)&mfi);
        dVar130 = *(double *)(lVar103 + 0x38);
        dVar125 = *(double *)(lVar103 + 0x40);
        dVar129 = *(double *)(lVar103 + 0x48);
        pFVar18 = (FabArray<amrex::IArrayBox> *)
                  **(undefined8 **)
                    &(this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar107].
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ;
        cccdom_pi.smallend.vect[0]._0_3_ = 0x10000;
        cccdom_pi.smallend.vect[1] = Gpu::Device::max_gpu_streams;
        cccdom_pi.bigend.vect[1] = DAT_007d7ef0;
        cccdom_pi.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
        cccdom_pi.bigend.vect[0] = SUB84(FabArrayBase::mfiter_tile_size,4);
        cccdom_pi.smallend.vect[0]._0_2_ = 0x101;
        MFIter::MFIter(&mfi,(FabArrayBase *)
                            frhs.
                            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar38]._M_t.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (MFItInfo *)&cccdom_pi);
        dVar130 = dVar130 * 0.25;
        dVar125 = dVar125 * 0.25;
        dVar129 = dVar129 * 0.25;
        facy = -dVar130;
        uStack_500 = 0x8000000000000000;
        facz = -dVar129;
        uStack_510 = 0x8000000000000000;
        while (mfi.currentIndex < mfi.endIndex) {
          MFIter::tilebox((Box *)&cell,&mfi);
          MFIter::validbox((Box *)&mfi_3,&mfi);
          result_1.smallend.vect[1] =
               mfi_3.m_fa._M_t.
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_;
          result_1.smallend.vect[0] =
               (int)mfi_3.m_fa._M_t.
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          result_1.bigend.vect[1] = mfi_3.tile_size.vect[0];
          result_1.bigend.vect[2] = mfi_3.tile_size.vect[1];
          result_1.smallend.vect[2] = (int)mfi_3.fabArray;
          result_1.bigend.vect[0] = mfi_3.fabArray._4_4_;
          if (iVar32 != 1) {
            result_1.smallend.vect[1] =
                 mfi_3.m_fa._M_t.
                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ * iVar32;
            result_1.smallend.vect[0] =
                 (int)mfi_3.m_fa._M_t.
                      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl * iVar32;
            result_1.smallend.vect[2] = (int)mfi_3.fabArray * iVar32;
            uVar31 = (uint)((mfi_3.tile_size.vect[2] & 2U) == 0);
            uVar49 = (uint)((mfi_3.tile_size.vect[2] & 4U) == 0);
            result_1.bigend.vect[0] =
                 (mfi_3.fabArray._4_4_ + (~mfi_3.tile_size.vect[2] & 1U)) * iVar32 -
                 (~mfi_3.tile_size.vect[2] & 1U);
            result_1.bigend.vect[1] = (mfi_3.tile_size.vect[0] + uVar31) * iVar32 - uVar31;
            result_1.bigend.vect[2] = (mfi_3.tile_size.vect[1] + uVar49) * iVar32 - uVar49;
          }
          bx_2.bigend.vect[1] = result_1.bigend.vect[1];
          bx_2.bigend.vect[2] = result_1.bigend.vect[2];
          bx_2.smallend.vect[0] = result_1.smallend.vect[0];
          bx_2.smallend.vect[1] = result_1.smallend.vect[1];
          bx_2.smallend.vect[2] = result_1.smallend.vect[2];
          bx_2.bigend.vect[0] = result_1.bigend.vect[0];
          for (lVar63 = 0; lVar63 != 3; lVar63 = lVar63 + 1) {
            if (((uint)mfi_3.tile_size.vect[2] >> ((uint)lVar63 & 0x1f) & 1) != 0) {
              piVar39 = bx_2.bigend.vect + lVar63;
              *piVar39 = *piVar39 + -1;
            }
          }
          bx_2.btype.itype = 0;
          bx.bigend.vect[1] = bx_2.bigend.vect[1];
          bx.bigend.vect[2] = (int)(ulong)(uint)bx_2.bigend.vect[2];
          bx.btype.itype = (int)((ulong)(uint)bx_2.bigend.vect[2] >> 0x20);
          bx.smallend.vect[0] = result_1.smallend.vect[0];
          bx.smallend.vect[1] = result_1.smallend.vect[1];
          bx.smallend.vect[2] = result_1.smallend.vect[2];
          bx.bigend.vect[0] = bx_2.bigend.vect[0];
          paVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar20 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (lVar63 = 0; lVar63 != 0xc; lVar63 = lVar63 + 4) {
            if ((*(int *)((long)paVar13->_M_elems + lVar63) == 0x6a) &&
               (iVar42 = *(int *)((long)bx.smallend.vect + lVar63),
               iVar42 == *(int *)(lVar103 + 0xac + lVar63))) {
              *(int *)((long)bx.smallend.vect + lVar63) = iVar42 + -1;
            }
            if ((*(int *)((long)paVar20->_M_elems + lVar63) == 0x6a) &&
               (iVar42 = *(int *)((long)bx.bigend.vect + lVar63),
               iVar42 == *(int *)(lVar103 + 0xb8 + lVar63))) {
              *(int *)((long)bx.bigend.vect + lVar63) = iVar42 + 1;
            }
          }
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&mfi_3,
                     &(frhs.
                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar38]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&domain,
                     &(vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar107]->
                      super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_648,
                     &(rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar107]->
                      super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&dlo,pFVar18,&mfi);
          iVar42 = cell.vect[1];
          uVar73 = (ulong)(uint)cell.vect[0];
          uVar56 = (ulong)(uint)cell.vect[2];
          local_5d0 = uVar73;
          if (iVar32 == 2) {
            local_4a8 = CONCAT44(local_4a8._4_4_,cell.vect[2] * 2 + -1);
            iVar97 = cell.vect[1] * 2;
            local_490 = CONCAT44(local_490._4_4_,cell.vect[0] * 2);
            local_498 = CONCAT44(local_498._4_4_,cell.vect[0] * 2 + -1);
            while (iVar37 = (int)uVar56, iVar37 <= iStack_36c) {
              iVar57 = (int)local_4a8;
              RVar72 = (Real)(long)(int)local_4a8;
              lVar63 = (long)iVar37 * 2;
              iVar67 = (int)lVar63;
              local_4a0 = uVar56;
              iVar50 = iVar42;
              iVar45 = iVar97 + -1;
              while (iVar50 <= local_370) {
                local_5d8 = CONCAT44(local_5d8._4_4_,iVar50);
                if ((int)uVar73 <= iStack_374) {
                  lVar40 = (long)iVar50 * 2;
                  iVar36 = (int)lVar40;
                  local_820 = local_490 & 0xffffffff;
                  local_748 = local_498 & 0xffffffff;
                  uVar73 = local_5d0;
                  do {
                    iVar91 = (int)uVar73;
                    lVar96 = (long)iVar91 * 2;
                    if (*(int *)((lVar40 - local_4c4) * CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 4 +
                                 dlo.vect._0_8_ + (lVar96 - local_4c8) * 4 +
                                (lVar63 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 4)
                        == 0) {
                      dVar134 = 0.0;
                    }
                    else {
                      uVar31 = (uint)lVar96 | 1;
                      if (result_1.bigend.vect[0] < (int)uVar31) {
                        uVar31 = result_1.bigend.vect[0];
                      }
                      iVar51 = result_1.smallend.vect[1];
                      if (result_1.smallend.vect[1] < iVar36 + -1) {
                        iVar51 = iVar36 + -1;
                      }
                      iVar58 = result_1.bigend.vect[1];
                      if (iVar36 + 1 <= result_1.bigend.vect[1]) {
                        iVar58 = iVar36 + 1;
                      }
                      iVar62 = result_1.smallend.vect[2];
                      if (result_1.smallend.vect[2] < iVar67 + -1) {
                        iVar62 = iVar67 + -1;
                      }
                      iVar68 = result_1.bigend.vect[2];
                      if (iVar67 + 1 <= result_1.bigend.vect[2]) {
                        iVar68 = iVar67 + 1;
                      }
                      iVar78 = iVar57;
                      if (iVar57 < result_1.smallend.vect[2]) {
                        iVar78 = result_1.smallend.vect[2];
                      }
                      iVar78 = iVar78 + -1;
                      iVar87 = iVar45;
                      if (iVar45 < result_1.smallend.vect[1]) {
                        iVar87 = result_1.smallend.vect[1];
                      }
                      lVar96 = (long)result_1.smallend.vect[0];
                      if ((long)result_1.smallend.vect[0] <= (long)(int)local_748) {
                        lVar96 = (long)(int)local_748;
                      }
                      lVar76 = (long)result_1.smallend.vect[1];
                      if ((long)result_1.smallend.vect[1] <= (long)iVar45) {
                        lVar76 = (long)iVar45;
                      }
                      facz_4 = (Real)(long)result_1.smallend.vect[2];
                      if ((long)result_1.smallend.vect[2] <= (long)RVar72) {
                        facz_4 = RVar72;
                      }
                      iVar33 = (int)local_748;
                      if ((int)local_748 < result_1.smallend.vect[0]) {
                        iVar33 = result_1.smallend.vect[0];
                      }
                      dVar134 = 0.0;
                      for (; iVar62 <= iVar68; iVar62 = iVar62 + 1) {
                        iVar34 = iVar67 - iVar62;
                        iVar43 = -iVar34;
                        if (iVar34 < 1) {
                          iVar43 = iVar34;
                        }
                        lVar111 = (long)iVar62;
                        iVar34 = iVar87 + -1;
                        local_850 = lVar76;
                        for (iVar99 = iVar51; iVar99 <= iVar58; iVar99 = iVar99 + 1) {
                          local_5f8 = (double)(long)iVar34;
                          iVar35 = iVar36 - iVar99;
                          iVar44 = -iVar35;
                          if (iVar35 < 1) {
                            iVar44 = iVar35;
                          }
                          local_608 = (double)(long)iVar99;
                          lVar41 = (long)local_608 + -1;
                          iVar35 = (int)local_820 - iVar33;
                          for (lVar46 = lVar96; iVar106 = (int)lVar46, iVar106 <= (int)uVar31;
                              lVar46 = lVar46 + 1) {
                            iVar23 = -iVar35;
                            if (iVar35 < 1) {
                              iVar23 = iVar35;
                            }
                            bVar112 = Box::strictly_contains(&result_1,iVar106,iVar99,iVar62);
                            if (bVar112) {
                              local_858 = *(double *)
                                           ((local_850 - local_648.begin.y) *
                                            CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride)
                                            * 8 + ((long)facz_4 - (long)local_648.begin.z) *
                                                  CONCAT44(local_648.kstride._4_4_,
                                                           (int)local_648.kstride) * 8 +
                                            (long)local_648.begin.x * -8 +
                                            CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                           lVar46 * 8);
                            }
                            else {
                              iVar102 = iVar106 + -1;
                              iVar98 = (int)lVar41;
                              iVar61 = (int)(lVar111 + -1);
                              bVar112 = Box::contains(&bx,iVar102,iVar98,iVar61);
                              local_858 = 0.0;
                              if (bVar112) {
                                lVar65 = ((lVar111 + -1) - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = (lVar41 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * facz +
                                            (*(double *)(lVar55 + lVar65 * 8) * facy -
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125) + 0.0;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar98,iVar61);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)local_5f8 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)iVar78 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * facz +
                                            (*(double *)
                                              (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                              lVar46 * 8) * dVar130 -
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar99,iVar61);
                              if (bVar112) {
                                lVar65 = ((long)iVar61 - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)local_608 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * facz +
                                            *(double *)(lVar55 + lVar65 * 8) * facy +
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar99,iVar61);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)iVar78 - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8 +
                                         (local_850 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * facz +
                                            *(double *)
                                             (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar130 +
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar98,iVar62);
                              if (bVar112) {
                                lVar65 = (lVar111 - (int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)iVar98 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * dVar129 +
                                            (*(double *)(lVar55 + lVar65 * 8) * facy -
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar98,iVar62);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)local_5f8 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)facz_4 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar129 +
                                            (*(double *)
                                              (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                              lVar46 * 8) * dVar130 -
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar99,iVar62);
                              if (bVar112) {
                                lVar65 = (lVar111 - (int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)local_608 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * dVar129 +
                                            *(double *)(lVar55 + lVar65 * 8) * facy +
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar99,iVar62);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = (local_850 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)facz_4 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar129 +
                                            *(double *)
                                             (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar130 +
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125;
                              }
                            }
                            dVar134 = dVar134 + (double)((iVar23 + 2) * (iVar44 + 2) * (iVar43 + 2))
                                                * local_858;
                            iVar35 = iVar35 + -1;
                          }
                          iVar34 = iVar34 + 1;
                          local_850 = local_850 + 1;
                        }
                        iVar78 = iVar78 + 1;
                        facz_4 = (Real)((long)facz_4 + 1);
                      }
                      dVar134 = dVar134 * 0.015625;
                      rhs = local_4f0;
                    }
                    *(double *)
                     (((long)iVar50 - (long)mfi_3.beginIndex) *
                      CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                      CONCAT44(mfi_3.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                               _4_4_,(int)mfi_3.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl) +
                      ((long)iVar91 - (long)mfi_3.currentIndex) * 8 +
                     ((long)iVar37 - (long)mfi_3.endIndex) *
                     CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8) = dVar134;
                    uVar73 = (ulong)(iVar91 + 1);
                    local_748 = (ulong)((int)local_748 + 2);
                    local_820 = (ulong)((int)local_820 + 2);
                  } while (iVar91 != iStack_374);
                }
                iVar45 = iVar45 + 2;
                uVar73 = local_5d0;
                iVar50 = (int)local_5d8 + 1;
              }
              local_4a8 = CONCAT44(local_4a8._4_4_,(int)local_4a8 + 2);
              uVar56 = (ulong)((int)local_4a0 + 1);
            }
          }
          else {
            local_4a8 = CONCAT44(local_4a8._4_4_,cell.vect[2] * 4 + -3);
            iVar97 = cell.vect[1] * 4;
            local_490 = CONCAT44(local_490._4_4_,cell.vect[0] * 4);
            local_498 = CONCAT44(local_498._4_4_,cell.vect[0] * 4 + -3);
            while (iVar37 = (int)uVar56, iVar37 <= iStack_36c) {
              iVar57 = (int)local_4a8;
              RVar72 = (Real)(long)(int)local_4a8;
              lVar63 = (long)iVar37 * 4;
              iVar67 = (int)lVar63;
              local_4a0 = uVar56;
              iVar50 = iVar42;
              iVar45 = iVar97 + -3;
              while (iVar50 <= local_370) {
                local_5d8 = CONCAT44(local_5d8._4_4_,iVar50);
                if ((int)uVar73 <= iStack_374) {
                  lVar40 = (long)iVar50 * 4;
                  iVar36 = (int)lVar40;
                  local_820 = local_490 & 0xffffffff;
                  local_748 = local_498 & 0xffffffff;
                  uVar73 = local_5d0;
                  do {
                    iVar91 = (int)uVar73;
                    lVar96 = (long)iVar91 * 4;
                    if (*(int *)((lVar40 - local_4c4) * CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 4 +
                                 dlo.vect._0_8_ + (lVar96 - local_4c8) * 4 +
                                (lVar63 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 4)
                        == 0) {
                      dVar134 = 0.0;
                    }
                    else {
                      uVar31 = (uint)lVar96 | 3;
                      if (result_1.bigend.vect[0] < (int)uVar31) {
                        uVar31 = result_1.bigend.vect[0];
                      }
                      iVar51 = result_1.smallend.vect[1];
                      if (result_1.smallend.vect[1] < iVar36 + -3) {
                        iVar51 = iVar36 + -3;
                      }
                      iVar58 = result_1.bigend.vect[1];
                      if (iVar36 + 3 <= result_1.bigend.vect[1]) {
                        iVar58 = iVar36 + 3;
                      }
                      iVar62 = result_1.smallend.vect[2];
                      if (result_1.smallend.vect[2] < iVar67 + -3) {
                        iVar62 = iVar67 + -3;
                      }
                      iVar68 = result_1.bigend.vect[2];
                      if (iVar67 + 3 <= result_1.bigend.vect[2]) {
                        iVar68 = iVar67 + 3;
                      }
                      iVar78 = iVar57;
                      if (iVar57 < result_1.smallend.vect[2]) {
                        iVar78 = result_1.smallend.vect[2];
                      }
                      iVar78 = iVar78 + -1;
                      iVar87 = iVar45;
                      if (iVar45 < result_1.smallend.vect[1]) {
                        iVar87 = result_1.smallend.vect[1];
                      }
                      lVar96 = (long)result_1.smallend.vect[0];
                      if ((long)result_1.smallend.vect[0] <= (long)(int)local_748) {
                        lVar96 = (long)(int)local_748;
                      }
                      lVar76 = (long)result_1.smallend.vect[1];
                      if ((long)result_1.smallend.vect[1] <= (long)iVar45) {
                        lVar76 = (long)iVar45;
                      }
                      facz_4 = (Real)(long)result_1.smallend.vect[2];
                      if ((long)result_1.smallend.vect[2] <= (long)RVar72) {
                        facz_4 = RVar72;
                      }
                      iVar33 = (int)local_748;
                      if ((int)local_748 < result_1.smallend.vect[0]) {
                        iVar33 = result_1.smallend.vect[0];
                      }
                      dVar134 = 0.0;
                      for (; iVar62 <= iVar68; iVar62 = iVar62 + 1) {
                        iVar34 = iVar67 - iVar62;
                        iVar43 = -iVar34;
                        if (iVar34 < 1) {
                          iVar43 = iVar34;
                        }
                        lVar111 = (long)iVar62;
                        iVar34 = iVar87 + -1;
                        local_850 = lVar76;
                        for (iVar99 = iVar51; iVar99 <= iVar58; iVar99 = iVar99 + 1) {
                          local_5f8 = (double)(long)iVar34;
                          iVar35 = iVar36 - iVar99;
                          iVar44 = -iVar35;
                          if (iVar35 < 1) {
                            iVar44 = iVar35;
                          }
                          local_608 = (double)(long)iVar99;
                          lVar41 = (long)local_608 + -1;
                          iVar35 = (int)local_820 - iVar33;
                          for (lVar46 = lVar96; iVar106 = (int)lVar46, iVar106 <= (int)uVar31;
                              lVar46 = lVar46 + 1) {
                            iVar23 = -iVar35;
                            if (iVar35 < 1) {
                              iVar23 = iVar35;
                            }
                            bVar112 = Box::strictly_contains(&result_1,iVar106,iVar99,iVar62);
                            if (bVar112) {
                              local_858 = *(double *)
                                           ((local_850 - local_648.begin.y) *
                                            CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride)
                                            * 8 + ((long)facz_4 - (long)local_648.begin.z) *
                                                  CONCAT44(local_648.kstride._4_4_,
                                                           (int)local_648.kstride) * 8 +
                                            (long)local_648.begin.x * -8 +
                                            CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                           lVar46 * 8);
                            }
                            else {
                              iVar102 = iVar106 + -1;
                              iVar98 = (int)lVar41;
                              iVar61 = (int)(lVar111 + -1);
                              bVar112 = Box::contains(&bx,iVar102,iVar98,iVar61);
                              local_858 = 0.0;
                              if (bVar112) {
                                lVar65 = ((lVar111 + -1) - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = (lVar41 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * facz +
                                            (*(double *)(lVar55 + lVar65 * 8) * facy -
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125) + 0.0;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar98,iVar61);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)local_5f8 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)iVar78 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * facz +
                                            (*(double *)
                                              (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                              lVar46 * 8) * dVar130 -
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar99,iVar61);
                              if (bVar112) {
                                lVar65 = ((long)iVar61 - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)local_608 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * facz +
                                            *(double *)(lVar55 + lVar65 * 8) * facy +
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar99,iVar61);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)iVar78 - (long)(int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8 +
                                         (local_850 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * facz +
                                            *(double *)
                                             (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar130 +
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar98,iVar62);
                              if (bVar112) {
                                lVar65 = (lVar111 - (int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)iVar98 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * dVar129 +
                                            (*(double *)(lVar55 + lVar65 * 8) * facy -
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar98,iVar62);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = ((long)local_5f8 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)facz_4 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar129 +
                                            (*(double *)
                                              (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                              lVar46 * 8) * dVar130 -
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125);
                              }
                              bVar112 = Box::contains(&bx,iVar102,iVar99,iVar62);
                              if (bVar112) {
                                lVar65 = (lVar111 - (int)local_790) *
                                         CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
                                lVar55 = ((long)local_608 - (long)(int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + domain.smallend.vect._0_8_ +
                                         (long)(int)(~local_798 + iVar106) * 8;
                                lVar60 = lVar55 + lVar65 * 8;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                             lVar60) * dVar129 +
                                            *(double *)(lVar55 + lVar65 * 8) * facy +
                                            *(double *)
                                             (lVar60 + CONCAT44(uStack_79c,domain.btype.itype) * 8)
                                            * dVar125;
                              }
                              bVar112 = Box::contains(&bx,iVar106,iVar99,iVar62);
                              if (bVar112) {
                                lVar60 = (long)(int)local_798;
                                lVar55 = (local_850 - (int)local_794) *
                                         CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8
                                         + ((long)facz_4 - (long)(int)local_790) *
                                           CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8
                                ;
                                local_858 = local_858 +
                                            *(double *)
                                             (CONCAT44(uStack_79c,domain.btype.itype) * 0x10 +
                                              lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar129 +
                                            *(double *)
                                             (lVar55 + lVar60 * -8 + domain.smallend.vect._0_8_ +
                                             lVar46 * 8) * dVar130 +
                                            *(double *)
                                             (lVar55 + CONCAT44(uStack_79c,domain.btype.itype) * 8 +
                                              lVar60 * -8 + domain.smallend.vect._0_8_ + lVar46 * 8)
                                            * dVar125;
                              }
                            }
                            dVar134 = dVar134 + (double)((iVar23 + 4) * (iVar44 + 4) * (iVar43 + 4))
                                                * local_858;
                            iVar35 = iVar35 + -1;
                          }
                          iVar34 = iVar34 + 1;
                          local_850 = local_850 + 1;
                        }
                        iVar78 = iVar78 + 1;
                        facz_4 = (Real)((long)facz_4 + 1);
                      }
                      dVar134 = dVar134 * 0.000244140625;
                      rhs = local_4f0;
                    }
                    *(double *)
                     (((long)iVar50 - (long)mfi_3.beginIndex) *
                      CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                      CONCAT44(mfi_3.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                               _4_4_,(int)mfi_3.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl) +
                      ((long)iVar91 - (long)mfi_3.currentIndex) * 8 +
                     ((long)iVar37 - (long)mfi_3.endIndex) *
                     CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8) = dVar134;
                    uVar73 = (ulong)(iVar91 + 1);
                    local_748 = (ulong)((int)local_748 + 4);
                    local_820 = (ulong)((int)local_820 + 4);
                  } while (iVar91 != iStack_374);
                }
                iVar45 = iVar45 + 4;
                uVar73 = local_5d0;
                iVar50 = (int)local_5d8 + 1;
              }
              local_4a8 = CONCAT44(local_4a8._4_4_,(int)local_4a8 + 4);
              uVar56 = (ulong)((int)local_4a0 + 1);
            }
          }
          pFVar15 = &(rhcc.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar107]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                     super_FabArray<amrex::FArrayBox>;
          if (pFVar15 != (FabArray<amrex::FArrayBox> *)0x0) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&dhi,pFVar15,&mfi);
            lVar96 = (long)cell.vect[2];
            lVar63 = (long)bx_2.smallend.vect[0];
            dVar134 = (double)(long)bx_2.smallend.vect[1];
            lVar40 = (long)bx_2.smallend.vect[2];
            if (iVar32 == 2) {
              iVar42 = cell.vect[2] * 2 + -2;
              while( true ) {
                lVar76 = (long)iVar42;
                if (iVar42 < lVar40) {
                  lVar76 = lVar40;
                }
                iVar97 = iVar42;
                if (iVar42 < bx_2.smallend.vect[2]) {
                  iVar97 = bx_2.smallend.vect[2];
                }
                if (iStack_36c < lVar96) break;
                iVar37 = (int)(lVar96 * 2);
                iVar45 = iVar37 + 1;
                if (bx_2.bigend.vect[2] < iVar45) {
                  iVar45 = bx_2.bigend.vect[2];
                }
                lVar111 = (long)cell.vect[1];
                iVar67 = cell.vect[1] * 2 + -2;
                while( true ) {
                  local_608 = (double)(long)iVar67;
                  if ((long)iVar67 < (long)dVar134) {
                    local_608 = dVar134;
                  }
                  iVar57 = iVar67;
                  if (iVar67 < bx_2.smallend.vect[1]) {
                    iVar57 = bx_2.smallend.vect[1];
                  }
                  if (local_370 < lVar111) break;
                  iVar50 = (int)(lVar111 * 2);
                  iVar36 = iVar50 + 1;
                  if (bx_2.bigend.vect[1] < iVar36) {
                    iVar36 = bx_2.bigend.vect[1];
                  }
                  local_5f8 = (double)((lVar111 * 2 - (long)local_4c4) *
                                       CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 4 + dlo.vect._0_8_ +
                                      (lVar96 * 2 - (long)local_4c0) *
                                      CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 4);
                  lVar46 = (lVar111 - mfi_3.beginIndex) *
                           CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                           CONCAT44(mfi_3.m_fa._M_t.
                                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                    _M_head_impl._4_4_,
                                    (int)mfi_3.m_fa._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl) +
                           (lVar96 - mfi_3.endIndex) *
                           CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8;
                  lVar41 = (long)cell.vect[0];
                  iVar91 = cell.vect[0] * 2 + -2;
                  iVar51 = cell.vect[0] * -2;
                  while( true ) {
                    lVar55 = (long)iVar91;
                    if (iVar91 < lVar63) {
                      lVar55 = lVar63;
                    }
                    iVar58 = iVar91;
                    if (iVar91 < bx_2.smallend.vect[0]) {
                      iVar58 = bx_2.smallend.vect[0];
                    }
                    if (iStack_374 < lVar41) break;
                    if (*(int *)((long)local_5f8 + (lVar41 * 2 - (long)local_4c8) * 4) != 0) {
                      uVar31 = (uint)(lVar41 * 2) | 1;
                      if (bx_2.bigend.vect[0] < (int)uVar31) {
                        uVar31 = bx_2.bigend.vect[0];
                      }
                      pdVar66 = (double *)
                                (((long)local_608 - (long)(int)local_3d4) *
                                 CONCAT44(uStack_3ec,dhi.vect[2]) * 8 +
                                 (lVar76 - (int)local_3d0) * local_3e8 * 8 + lVar55 * 8 +
                                 (long)local_3d8 * -8 + dhi.vect._0_8_);
                      dVar126 = 0.0;
                      for (lVar55 = (long)iVar97; lVar55 <= iVar45; lVar55 = lVar55 + 1) {
                        pdVar85 = pdVar66;
                        for (lVar60 = (long)iVar57; lVar60 <= iVar36; lVar60 = lVar60 + 1) {
                          pdVar86 = pdVar85;
                          for (lVar65 = (long)iVar58; lVar65 <= (int)uVar31; lVar65 = lVar65 + 1) {
                            dVar126 = dVar126 + (2.0 - ABS((double)(iVar51 + (int)lVar65) + 0.5)) *
                                                (2.0 - ABS((double)((int)lVar60 - iVar50) + 0.5)) *
                                                (2.0 - ABS((double)((int)lVar55 - iVar37) + 0.5)) *
                                                *pdVar86;
                            pdVar86 = pdVar86 + 1;
                          }
                          pdVar85 = pdVar85 + CONCAT44(uStack_3ec,dhi.vect[2]);
                        }
                        pdVar66 = pdVar66 + local_3e8;
                      }
                      *(double *)(lVar46 + (lVar41 - mfi_3.currentIndex) * 8) =
                           dVar126 * 0.015625 +
                           *(double *)(lVar46 + (lVar41 - mfi_3.currentIndex) * 8);
                      rhs = local_4f0;
                    }
                    lVar41 = lVar41 + 1;
                    iVar91 = iVar91 + 2;
                    iVar51 = iVar51 + -2;
                  }
                  lVar111 = lVar111 + 1;
                  iVar67 = iVar67 + 2;
                }
                lVar96 = lVar96 + 1;
                iVar42 = iVar42 + 2;
              }
            }
            else {
              iVar42 = cell.vect[2] * 4 + -4;
              while( true ) {
                lVar76 = (long)iVar42;
                if (iVar42 < lVar40) {
                  lVar76 = lVar40;
                }
                iVar97 = iVar42;
                if (iVar42 < bx_2.smallend.vect[2]) {
                  iVar97 = bx_2.smallend.vect[2];
                }
                if (iStack_36c < lVar96) break;
                iVar37 = (int)(lVar96 * 4);
                iVar45 = iVar37 + 3;
                if (bx_2.bigend.vect[2] < iVar45) {
                  iVar45 = bx_2.bigend.vect[2];
                }
                lVar111 = (long)cell.vect[1];
                iVar67 = cell.vect[1] * 4 + -4;
                while( true ) {
                  local_608 = (double)(long)iVar67;
                  if ((long)iVar67 < (long)dVar134) {
                    local_608 = dVar134;
                  }
                  iVar57 = iVar67;
                  if (iVar67 < bx_2.smallend.vect[1]) {
                    iVar57 = bx_2.smallend.vect[1];
                  }
                  if (local_370 < lVar111) break;
                  iVar50 = (int)(lVar111 * 4);
                  iVar36 = iVar50 + 3;
                  if (bx_2.bigend.vect[1] < iVar36) {
                    iVar36 = bx_2.bigend.vect[1];
                  }
                  local_5f8 = (double)((lVar111 * 4 - (long)local_4c4) *
                                       CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 4 + dlo.vect._0_8_ +
                                      (lVar96 * 4 - (long)local_4c0) *
                                      CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 4);
                  lVar46 = (lVar111 - mfi_3.beginIndex) *
                           CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                           CONCAT44(mfi_3.m_fa._M_t.
                                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                    _M_head_impl._4_4_,
                                    (int)mfi_3.m_fa._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl) +
                           (lVar96 - mfi_3.endIndex) *
                           CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8;
                  lVar41 = (long)cell.vect[0];
                  iVar91 = cell.vect[0] * 4 + -4;
                  iVar51 = cell.vect[0] * -4;
                  while( true ) {
                    lVar55 = (long)iVar91;
                    if (iVar91 < lVar63) {
                      lVar55 = lVar63;
                    }
                    iVar58 = iVar91;
                    if (iVar91 < bx_2.smallend.vect[0]) {
                      iVar58 = bx_2.smallend.vect[0];
                    }
                    if (iStack_374 < lVar41) break;
                    if (*(int *)((long)local_5f8 + (lVar41 * 4 - (long)local_4c8) * 4) != 0) {
                      uVar31 = (uint)(lVar41 * 4) | 3;
                      if (bx_2.bigend.vect[0] < (int)uVar31) {
                        uVar31 = bx_2.bigend.vect[0];
                      }
                      pdVar66 = (double *)
                                (((long)local_608 - (long)(int)local_3d4) *
                                 CONCAT44(uStack_3ec,dhi.vect[2]) * 8 +
                                 (lVar76 - (int)local_3d0) * local_3e8 * 8 + lVar55 * 8 +
                                 (long)local_3d8 * -8 + dhi.vect._0_8_);
                      dVar126 = 0.0;
                      for (lVar55 = (long)iVar97; lVar55 <= iVar45; lVar55 = lVar55 + 1) {
                        pdVar85 = pdVar66;
                        for (lVar60 = (long)iVar57; lVar60 <= iVar36; lVar60 = lVar60 + 1) {
                          pdVar86 = pdVar85;
                          for (lVar65 = (long)iVar58; lVar65 <= (int)uVar31; lVar65 = lVar65 + 1) {
                            dVar126 = dVar126 + (4.0 - ABS((double)(iVar51 + (int)lVar65) + 0.5)) *
                                                (4.0 - ABS((double)((int)lVar60 - iVar50) + 0.5)) *
                                                (4.0 - ABS((double)((int)lVar55 - iVar37) + 0.5)) *
                                                *pdVar86;
                            pdVar86 = pdVar86 + 1;
                          }
                          pdVar85 = pdVar85 + CONCAT44(uStack_3ec,dhi.vect[2]);
                        }
                        pdVar66 = pdVar66 + local_3e8;
                      }
                      *(double *)(lVar46 + (lVar41 - mfi_3.currentIndex) * 8) =
                           dVar126 * 0.000244140625 +
                           *(double *)(lVar46 + (lVar41 - mfi_3.currentIndex) * 8);
                      rhs = local_4f0;
                    }
                    lVar41 = lVar41 + 1;
                    iVar91 = iVar91 + 4;
                    iVar51 = iVar51 + -4;
                  }
                  lVar111 = lVar111 + 1;
                  iVar67 = iVar67 + 4;
                }
                lVar96 = lVar96 + 1;
                iVar42 = iVar42 + 4;
              }
            }
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
        lVar38 = lVar107;
      }
      for (lVar38 = 0; lVar38 < (int)uVar73; lVar38 = lVar38 + 1) {
        pMVar17 = rhs_cc.
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar38]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        if (pMVar17 != (MultiFab *)0x0) {
          MultiFab::Add((rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar38],pMVar17,0,0,1,0);
          uVar73 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
        }
      }
      uVar31 = (int)uVar73 - 2;
      do {
        if ((int)uVar31 < 0) {
          for (lVar38 = 0; uVar73 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
              lVar38 < (long)uVar73; lVar38 = lVar38 + 1) {
            ppMVar22 = (rhnd->
                       super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                       ).
                       super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar38 < (long)(rhnd->
                                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ).
                                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar22 >> 3) &&
               (pMVar17 = ppMVar22[lVar38], pMVar17 != (MultiFab *)0x0)) {
              MultiFab::Add((rhs->
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar38],pMVar17,0,0,1,0);
            }
          }
          for (lVar38 = 0; lVar38 < (int)uVar73; lVar38 = lVar38 + 1) {
            EB_set_covered((rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar38],0.0);
            uVar73 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
          }
          std::
          vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::~vector(&frhs.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   );
          std::
          vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::~vector(&rhs_cc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   );
          std::
          vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ::~vector(&rhcc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   );
          return;
        }
        pGVar14 = *(Geometry **)
                   &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar31].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        pMVar17 = (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar31];
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
        mfi_3.tile_size.vect[2] = 0;
        mfi_3.flags = '\0';
        mfi_3._29_3_ = 0;
        mfi_3.currentIndex = 0;
        mfi_3.beginIndex = 0;
        mfi_3.fabArray._0_4_ = 0;
        mfi_3.fabArray._4_4_ = 0;
        mfi_3.tile_size.vect[0] = 0;
        mfi_3.tile_size.vect[1] = 0;
        domain.smallend.vect._0_8_ = &PTR__FabFactory_007d2928;
        MultiFab::MultiFab((MultiFab *)&mfi,
                           (BoxArray *)
                           ((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           8),(DistributionMapping *)
                              ((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                              + 0x70),1,0,(MFInfo *)&mfi_3,(FabFactory<amrex::FArrayBox> *)&domain);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi_3.tile_size);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)&mfi,0.0);
        pFVar15 = &(frhs.
                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        PVar141 = Geometry::periodicity(pGVar14);
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
             PVar141.period.vect[0];
        mfi_3.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
             PVar141.period.vect[1];
        mfi_3.fabArray._0_4_ = PVar141.period.vect[2];
        FabArray<amrex::FArrayBox>::ParallelAdd
                  ((FabArray<amrex::FArrayBox> *)&mfi,pFVar15,(Periodicity *)&mfi_3);
        Geometry::growPeriodicDomain(pGVar14,1);
        cccdom_pi.bigend.vect[1] = bx.bigend.vect[1];
        cccdom_pi.bigend.vect[2] = bx.bigend.vect[2];
        cccdom_pi.btype.itype = bx.btype.itype;
        cccdom_pi.smallend.vect[0] = bx.smallend.vect[0];
        cccdom_pi.smallend.vect[1] = bx.smallend.vect[1];
        cccdom_pi.smallend.vect[2] = bx.smallend.vect[2];
        cccdom_pi.bigend.vect[0] = bx.bigend.vect[0];
        for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
          if (local_528.arr[lVar38] == inflow) {
            piVar39 = cccdom_pi.smallend.vect + lVar38;
            *piVar39 = *piVar39 + -1;
          }
          if (local_538.arr[lVar38] == inflow) {
            piVar39 = cccdom_pi.bigend.vect + lVar38;
            *piVar39 = *piVar39 + 1;
          }
        }
        result.smallend.vect._0_8_ = *(undefined8 *)(pGVar14->domain).smallend.vect;
        uVar24 = *(undefined8 *)((pGVar14->domain).smallend.vect + 2);
        uVar25 = *(undefined8 *)((pGVar14->domain).bigend.vect + 2);
        result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar14->domain).bigend.vect >> 0x20);
        result.bigend.vect[2] = (int)uVar25;
        result.btype.itype = (uint)((ulong)uVar25 >> 0x20);
        result.smallend.vect[2] = (int)uVar24;
        result.bigend.vect[0] = (int)((ulong)uVar24 >> 0x20);
        for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
          if ((result.btype.itype >> ((uint)lVar38 & 0x1f) & 1) == 0) {
            piVar39 = result.bigend.vect + lVar38;
            *piVar39 = *piVar39 + 1;
          }
        }
        result.btype.itype = 7;
        dVar130 = (pGVar14->super_CoordSys).inv_dx[0];
        dVar125 = (pGVar14->super_CoordSys).inv_dx[1];
        dVar129 = (pGVar14->super_CoordSys).inv_dx[2];
        pFVar18 = (FabArray<amrex::IArrayBox> *)
                  **(undefined8 **)
                    &(this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31].
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ;
        this_04.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t
        .super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->super_MLNodeLinOp).m_nd_fine_mask.
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        this_05.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t
        .super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->super_MLNodeLinOp).m_cc_fine_mask.
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        _Var21.
        super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
        .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
             (this->super_MLNodeLinOp).m_has_fine_bndry.
             super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
             super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ;
        local_28c.device_sync = true;
        local_28c.num_streams = Gpu::Device::max_gpu_streams;
        local_28c.do_tiling = true;
        local_28c.tilesize.vect[2] = DAT_007d7ef0;
        local_28c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
        local_28c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
        local_28c.dynamic = true;
        MFIter::MFIter(&mfi_3,(FabArrayBase *)
                              (rhs->
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar31],&local_28c);
        uVar24 = result.smallend.vect._0_8_;
        dVar130 = dVar130 * 0.25;
        dVar125 = dVar125 * 0.25;
        dVar129 = dVar129 * 0.25;
        dVar134 = -dVar130;
        local_5f8 = -dVar125;
        uStack_5f0 = 0x8000000000000000;
        local_608 = -dVar129;
        uStack_600 = 0x8000000000000000;
        while( true ) {
          if (mfi_3.endIndex <= mfi_3.currentIndex) break;
          iVar32 = mfi_3.currentIndex;
          if (mfi_3.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar32 = ((mfi_3.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[mfi_3.currentIndex];
          }
          if (*(int *)(*(long *)((long)_Var21.
                                       super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                                       .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>.
                                       _M_head_impl + 0xf0) + (long)iVar32 * 4) != 0) {
            MFIter::tilebox(&local_2e4,&mfi_3);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&domain,
                       &(rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar31]->
                        super_FabArray<amrex::FArrayBox>,&mfi_3);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_648,
                       &(vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar31]->
                        super_FabArray<amrex::FArrayBox>,&mfi_3);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&dlo,(FabArray<amrex::FArrayBox> *)&mfi,&mfi_3);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&dhi,pFVar18,&mfi_3);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&cell,
                       (FabArray<amrex::IArrayBox> *)
                       this_04.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&mfi_3);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&result_1,
                       (FabArray<amrex::IArrayBox> *)
                       this_05.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&mfi_3);
            pFVar15 = &(rhcc.
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                       super_FabArray<amrex::FArrayBox>;
            if (pFVar15 == (FabArray<amrex::FArrayBox> *)0x0) {
              bx_2.bigend.vect[1] = 0;
              bx_2.bigend.vect[2] = 0;
              bx_2.btype.itype = 0;
              bx_2.smallend.vect[0] = 0;
              bx_2.smallend.vect[1] = 0;
              bx_2.smallend.vect[2] = 0;
              bx_2.bigend.vect[0] = 0;
              local_558[0].x = 1;
              local_558[0].y = 1;
              local_558[0].z = 1;
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)&bx_2,pFVar15,&mfi_3);
            }
            iVar97 = local_2e4.bigend.vect[2];
            iVar42 = local_2e4.bigend.vect[1];
            lVar38 = (long)local_2e4.smallend.vect[0];
            lVar107 = (long)local_2e4.smallend.vect[1];
            iVar32 = local_2e4.bigend.vect[0];
            iVar37 = local_2e4.smallend.vect[1] + -1;
            iVar45 = local_2e4.smallend.vect[2] + -1;
            for (lVar103 = (long)local_2e4.smallend.vect[2]; iVar67 = (int)lVar103, iVar67 <= iVar97
                ; lVar103 = lVar103 + 1) {
              facy = (Real)(long)iVar45;
              facz = (Real)(long)iVar67;
              lVar40 = (long)facz + -1;
              iVar57 = iVar37;
              for (lVar63 = lVar107; iVar50 = (int)lVar63, iVar50 <= iVar42; lVar63 = lVar63 + 1) {
                lVar76 = (long)iVar57;
                lVar111 = (long)iVar50;
                for (lVar96 = lVar38; iVar36 = (int)lVar96, iVar36 <= iVar32; lVar96 = lVar96 + 1) {
                  if ((*(int *)((lVar63 - (int)local_3d4) * CONCAT44(uStack_3ec,dhi.vect[2]) * 4 +
                                (lVar103 - (int)local_3d0) * local_3e8 * 4 + (long)local_3d8 * -4 +
                                dhi.vect._0_8_ + lVar96 * 4) == 0) &&
                     (*(int *)((lVar63 - local_35c) * CONCAT44(iStack_374,cell.vect[2]) * 4 +
                               (lVar103 - local_358) * CONCAT44(iStack_36c,local_370) * 4 +
                               (long)local_360 * -4 + CONCAT44(cell.vect[1],cell.vect[0]) +
                              lVar96 * 4) == 1)) {
                    facy_2 = *(double *)
                              ((lVar63 - local_4c4) * CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 8 +
                               (lVar103 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 8 +
                               (long)local_4c8 * -8 + dlo.vect._0_8_ + lVar96 * 8);
                    iVar58 = iVar36 + -1;
                    iVar51 = (int)(lVar111 + -1);
                    lVar41 = (long)iVar51;
                    iVar91 = (int)lVar40;
                    lVar46 = (long)iVar91;
                    if ((*(int *)(((lVar111 + -1) - (long)local_5a4) *
                                  CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                  result_1.smallend.vect._0_8_ + (long)(int)(iVar58 - local_5a8) * 4
                                 + (lVar40 - local_5a0) *
                                   CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4) ==
                         0) && (((bVar112 = Box::contains(&cccdom_pi,iVar58,iVar51,iVar91), bVar112
                                 && (lVar65 = (lVar46 - local_648.begin.z) *
                                              CONCAT44(local_648.kstride._4_4_,
                                                       (int)local_648.kstride),
                                    lVar55 = (lVar41 - local_648.begin.y) *
                                             CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride
                                                     ) * 8 +
                                             CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                             (long)(~local_648.begin.x + iVar36) * 8,
                                    lVar60 = lVar55 + lVar65 * 8,
                                    facy_2 = facy_2 + *(double *)(local_648.nstride * 0x10 + lVar60)
                                                      * local_608 +
                                                      *(double *)(lVar55 + lVar65 * 8) * dVar134 +
                                                      *(double *)(lVar60 + local_648.nstride * 8) *
                                                      local_5f8, bx_2.smallend.vect._0_8_ != 0)) &&
                                (bVar112 = Box::contains(&bx,iVar58,iVar51,iVar91), bVar112)))) {
                      facy_2 = facy_2 + *(double *)
                                         ((lVar41 - local_558[0].y) *
                                          CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8 +
                                          bx_2.smallend.vect._0_8_ +
                                          (long)(~local_558[0].x + iVar36) * 8 +
                                         (lVar46 - local_558[0].z) *
                                         CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8) *
                                        0.125;
                    }
                    if ((*(int *)((lVar76 - local_5a4) *
                                  CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                  ((long)facy - (long)local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4 +
                                  (long)(int)local_5a8 * -4 + result_1.smallend.vect._0_8_ +
                                 lVar96 * 4) == 0) &&
                       (bVar112 = Box::contains(&cccdom_pi,iVar36,iVar51,iVar91), bVar112)) {
                      lVar65 = (long)local_648.begin.x;
                      lVar55 = (lVar76 - local_648.begin.y) *
                               CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8 +
                               ((long)facy - (long)local_648.begin.z) *
                               CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 8;
                      lVar60 = CONCAT44(local_648.p._4_4_,(int)local_648.p);
                      facy_2 = facy_2 + *(double *)
                                         (local_648.nstride * 0x10 + lVar55 + lVar65 * -8 + lVar60 +
                                         lVar96 * 8) * local_608 +
                                        *(double *)(lVar55 + lVar65 * -8 + lVar60 + lVar96 * 8) *
                                        dVar130 + *(double *)
                                                   (lVar55 + local_648.nstride * 8 + lVar65 * -8 +
                                                    lVar60 + lVar96 * 8) * local_5f8;
                      if ((bx_2.smallend.vect._0_8_ != 0) &&
                         (bVar112 = Box::contains(&bx,iVar36,iVar51,iVar91), bVar112)) {
                        facy_2 = facy_2 + *(double *)
                                           ((lVar76 - local_558[0].y) *
                                            CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8
                                            + ((long)facy - (long)local_558[0].z) *
                                              CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8
                                            + (long)local_558[0].x * -8 + bx_2.smallend.vect._0_8_ +
                                           lVar96 * 8) * 0.125;
                      }
                    }
                    if (((*(int *)((lVar111 - local_5a4) *
                                   CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                   result_1.smallend.vect._0_8_ +
                                   (long)(int)(~local_5a8 + iVar36) * 4 +
                                  (lVar46 - local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4) ==
                          0) && (bVar112 = Box::contains(&cccdom_pi,iVar58,iVar50,iVar91), bVar112))
                       && ((lVar65 = (lVar46 - local_648.begin.z) *
                                     CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride),
                           lVar55 = (lVar111 - local_648.begin.y) *
                                    CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8 +
                                    CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                    (long)(~local_648.begin.x + iVar36) * 8,
                           lVar60 = lVar55 + lVar65 * 8,
                           facy_2 = facy_2 + *(double *)(local_648.nstride * 0x10 + lVar60) *
                                             local_608 +
                                             *(double *)(lVar55 + lVar65 * 8) * dVar134 +
                                             *(double *)(lVar60 + local_648.nstride * 8) * dVar125,
                           bx_2.smallend.vect._0_8_ != 0 &&
                           (bVar112 = Box::contains(&bx,iVar58,iVar50,iVar91), bVar112)))) {
                      facy_2 = facy_2 + *(double *)
                                         ((lVar111 - local_558[0].y) *
                                          CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8 +
                                          bx_2.smallend.vect._0_8_ +
                                          (long)(~local_558[0].x + iVar36) * 8 +
                                         (lVar46 - local_558[0].z) *
                                         CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8) *
                                        0.125;
                    }
                    rhs = local_4f0;
                    if ((*(int *)(((long)facy - (long)local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4 +
                                  (lVar63 - local_5a4) *
                                  CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                  (long)(int)local_5a8 * -4 + result_1.smallend.vect._0_8_ +
                                 lVar96 * 4) == 0) &&
                       (bVar112 = Box::contains(&cccdom_pi,iVar36,iVar50,iVar91), bVar112)) {
                      lVar60 = (long)local_648.begin.x;
                      lVar46 = ((long)facy - (long)local_648.begin.z) *
                               CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 8 +
                               (lVar63 - local_648.begin.y) *
                               CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8;
                      lVar55 = CONCAT44(local_648.p._4_4_,(int)local_648.p);
                      facy_2 = facy_2 + *(double *)
                                         (local_648.nstride * 0x10 + lVar46 + lVar60 * -8 + lVar55 +
                                         lVar96 * 8) * local_608 +
                                        *(double *)(lVar46 + lVar60 * -8 + lVar55 + lVar96 * 8) *
                                        dVar130 + *(double *)
                                                   (lVar46 + local_648.nstride * 8 + lVar60 * -8 +
                                                    lVar55 + lVar96 * 8) * dVar125;
                      if ((bx_2.smallend.vect._0_8_ != 0) &&
                         (bVar112 = Box::contains(&bx,iVar36,iVar50,iVar91), bVar112)) {
                        facy_2 = facy_2 + *(double *)
                                           (((long)facy - (long)local_558[0].z) *
                                            CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8 +
                                            (lVar63 - local_558[0].y) *
                                            CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8
                                            + (long)local_558[0].x * -8 + bx_2.smallend.vect._0_8_ +
                                           lVar96 * 8) * 0.125;
                      }
                    }
                    if ((((*(int *)((lVar41 - local_5a4) *
                                    CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4
                                    + result_1.smallend.vect._0_8_ +
                                    (long)(int)(~local_5a8 + iVar36) * 4 +
                                   ((long)facz - (long)local_5a0) *
                                   CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4) ==
                           0) && (bVar112 = Box::contains(&cccdom_pi,iVar58,iVar51,iVar67), bVar112)
                         ) && (lVar60 = ((long)facz - (long)local_648.begin.z) *
                                        CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride),
                              lVar46 = (lVar41 - local_648.begin.y) *
                                       CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8
                                       + CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                       (long)(~local_648.begin.x + iVar36) * 8,
                              lVar55 = lVar46 + lVar60 * 8,
                              facy_2 = facy_2 + *(double *)(local_648.nstride * 0x10 + lVar55) *
                                                dVar129 + *(double *)(lVar46 + lVar60 * 8) * dVar134
                                                          + *(double *)
                                                             (lVar55 + local_648.nstride * 8) *
                                                            local_5f8, bx_2.smallend.vect._0_8_ != 0
                              )) && (bVar112 = Box::contains(&bx,iVar58,iVar51,iVar67), bVar112)) {
                      facy_2 = facy_2 + *(double *)
                                         ((lVar41 - local_558[0].y) *
                                          CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8 +
                                          bx_2.smallend.vect._0_8_ +
                                          (long)(~local_558[0].x + iVar36) * 8 +
                                         ((long)facz - (long)local_558[0].z) *
                                         CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8) *
                                        0.125;
                    }
                    if ((*(int *)((lVar76 - local_5a4) *
                                  CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                  (lVar103 - local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4 +
                                  (long)(int)local_5a8 * -4 + result_1.smallend.vect._0_8_ +
                                 lVar96 * 4) == 0) &&
                       (bVar112 = Box::contains(&cccdom_pi,iVar36,iVar51,iVar67), bVar112)) {
                      lVar55 = (long)local_648.begin.x;
                      lVar46 = (lVar76 - local_648.begin.y) *
                               CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8 +
                               (lVar103 - local_648.begin.z) *
                               CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 8;
                      lVar41 = CONCAT44(local_648.p._4_4_,(int)local_648.p);
                      facy_2 = facy_2 + *(double *)
                                         (local_648.nstride * 0x10 + lVar46 + lVar55 * -8 + lVar41 +
                                         lVar96 * 8) * dVar129 +
                                        *(double *)(lVar46 + lVar55 * -8 + lVar41 + lVar96 * 8) *
                                        dVar130 + *(double *)
                                                   (lVar46 + local_648.nstride * 8 + lVar55 * -8 +
                                                    lVar41 + lVar96 * 8) * local_5f8;
                      if ((bx_2.smallend.vect._0_8_ != 0) &&
                         (bVar112 = Box::contains(&bx,iVar36,iVar51,iVar67), bVar112)) {
                        facy_2 = facy_2 + *(double *)
                                           ((lVar76 - local_558[0].y) *
                                            CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8
                                            + (lVar103 - local_558[0].z) *
                                              CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8
                                            + (long)local_558[0].x * -8 + bx_2.smallend.vect._0_8_ +
                                           lVar96 * 8) * 0.125;
                      }
                    }
                    if (((*(int *)((lVar111 - local_5a4) *
                                   CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                   result_1.smallend.vect._0_8_ +
                                   (long)(int)(~local_5a8 + iVar36) * 4 +
                                  ((long)facz - (long)local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4) ==
                          0) && (bVar112 = Box::contains(&cccdom_pi,iVar58,iVar50,iVar67), bVar112))
                       && ((lVar55 = ((long)facz - (long)local_648.begin.z) *
                                     CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride),
                           lVar46 = (lVar111 - local_648.begin.y) *
                                    CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8 +
                                    CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                                    (long)(~local_648.begin.x + iVar36) * 8,
                           lVar41 = lVar46 + lVar55 * 8,
                           facy_2 = facy_2 + *(double *)(local_648.nstride * 0x10 + lVar41) *
                                             dVar129 + *(double *)(lVar46 + lVar55 * 8) * dVar134 +
                                                       *(double *)(lVar41 + local_648.nstride * 8) *
                                                       dVar125, bx_2.smallend.vect._0_8_ != 0 &&
                           (bVar112 = Box::contains(&bx,iVar58,iVar50,iVar67), bVar112)))) {
                      facy_2 = facy_2 + *(double *)
                                         ((lVar111 - local_558[0].y) *
                                          CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8 +
                                          bx_2.smallend.vect._0_8_ +
                                          (long)(~local_558[0].x + iVar36) * 8 +
                                         ((long)facz - (long)local_558[0].z) *
                                         CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8) *
                                        0.125;
                    }
                    if ((*(int *)((lVar63 - local_5a4) *
                                  CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 4 +
                                  (lVar103 - local_5a0) *
                                  CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 4 +
                                  (long)(int)local_5a8 * -4 + result_1.smallend.vect._0_8_ +
                                 lVar96 * 4) == 0) &&
                       (bVar112 = Box::contains(&cccdom_pi,iVar36,iVar50,iVar67), bVar112)) {
                      lVar55 = (long)local_648.begin.x;
                      lVar46 = (lVar63 - local_648.begin.y) *
                               CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 8 +
                               (lVar103 - local_648.begin.z) *
                               CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 8;
                      lVar41 = CONCAT44(local_648.p._4_4_,(int)local_648.p);
                      facy_2 = facy_2 + *(double *)
                                         (local_648.nstride * 0x10 + lVar46 + lVar55 * -8 + lVar41 +
                                         lVar96 * 8) * dVar129 +
                                        *(double *)(lVar46 + lVar55 * -8 + lVar41 + lVar96 * 8) *
                                        dVar130 + *(double *)
                                                   (lVar46 + local_648.nstride * 8 + lVar55 * -8 +
                                                    lVar41 + lVar96 * 8) * dVar125;
                      if ((bx_2.smallend.vect._0_8_ != 0) &&
                         (bVar112 = Box::contains(&bx,iVar36,iVar50,iVar67), bVar112)) {
                        facy_2 = facy_2 + *(double *)
                                           ((lVar63 - local_558[0].y) *
                                            CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8
                                            + (lVar103 - local_558[0].z) *
                                              CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8
                                            + (long)local_558[0].x * -8 + bx_2.smallend.vect._0_8_ +
                                           lVar96 * 8) * 0.125;
                      }
                    }
                    local_848 = (int)uVar24;
                    if (local_848 == iVar36) {
                      dVar126 = 2.0;
                      if ((local_528.arr[0] != Neumann) &&
                         (dVar126 = 2.0, local_528.arr[0] != inflow)) goto LAB_0065ec93;
                    }
                    else {
LAB_0065ec93:
                      dVar126 = 1.0;
                      if (iVar36 == result.bigend.vect[0]) {
                        dVar126 = *(double *)
                                   (&DAT_0071a420 +
                                   (ulong)((local_538.arr[0] - Neumann & 0xfffffffb) == 0) * 8);
                      }
                    }
                    if (((result.smallend.vect[1] == iVar50) &&
                        ((local_528.arr[1] == inflow || (local_528.arr[1] == Neumann)))) ||
                       ((result.bigend.vect[1] == iVar50 &&
                        ((local_538.arr[1] == inflow || (local_538.arr[1] == Neumann)))))) {
                      dVar126 = dVar126 + dVar126;
                    }
                    if (((result.smallend.vect[2] == iVar67) &&
                        ((local_528.arr[2] == inflow || (local_528.arr[2] == Neumann)))) ||
                       ((result.bigend.vect[2] == iVar67 &&
                        ((local_538.arr[2] == inflow || (local_538.arr[2] == Neumann)))))) {
                      dVar126 = dVar126 + dVar126;
                    }
                    *(double *)
                     ((lVar63 - (int)local_794) *
                      CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8 +
                      (lVar103 - (int)local_790) *
                      CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8 +
                      (long)(int)local_798 * -8 + domain.smallend.vect._0_8_ + lVar96 * 8) =
                         facy_2 * dVar126;
                  }
                }
                iVar57 = iVar57 + 1;
              }
              iVar45 = iVar45 + 1;
            }
          }
          MFIter::operator++(&mfi_3);
        }
        MFIter::~MFIter(&mfi_3);
        MultiFab::~MultiFab((MultiFab *)&mfi);
        uVar31 = uVar31 - 1;
      } while( true );
    }
    pGVar14 = *(Geometry **)
               &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar73].
                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_5e0 = uVar73;
    if (bVar112) {
      uVar24 = *(undefined8 *)((pGVar14->domain).smallend.vect + 2);
      uVar25 = *(undefined8 *)((pGVar14->domain).bigend.vect + 2);
      domain.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar14->domain).bigend.vect >> 0x20);
      domain.bigend.vect[2] = (int)uVar25;
      domain.btype.itype = (uint)((ulong)uVar25 >> 0x20);
      domain.smallend.vect._0_8_ = *(undefined8 *)(pGVar14->domain).smallend.vect;
      domain.smallend.vect[2] = (int)uVar24;
      domain.bigend.vect[0] = (int)((ulong)uVar24 >> 0x20);
      for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
        if (local_528.arr[lVar38] != inflow) {
          piVar39 = domain.smallend.vect + lVar38;
          *piVar39 = *piVar39 + -1;
        }
        if (local_538.arr[lVar38] != inflow) {
          piVar39 = domain.bigend.vect + lVar38;
          *piVar39 = *piVar39 + 1;
        }
      }
      dlo.vect[2] = domain.smallend.vect[2];
      dlo.vect[0] = domain.smallend.vect[0];
      dlo.vect[1] = domain.smallend.vect[1];
      dhi.vect[2] = domain.bigend.vect[2];
      dhi.vect[1] = domain.bigend.vect[1];
      dhi.vect[0] = domain.bigend.vect[0];
      MFIter::MFIter(&mfi,(FabArrayBase *)
                          (vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                          .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar73],true);
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::growntilebox((Box *)&local_648,&mfi,1);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&mfi_3,
                   &(vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_5e0]->
                    super_FabArray<amrex::FArrayBox>,&mfi);
        bVar30 = Box::contains(&domain,(Box *)&local_648);
        if (!bVar30) {
          for (lVar38 = (long)(int)local_648.jstride; lVar107 = (long)local_648.p._4_4_,
              (int)lVar38 <= local_648.kstride._4_4_; lVar38 = lVar38 + 1) {
            for (; (int)lVar107 <= (int)local_648.kstride; lVar107 = lVar107 + 1) {
              iVar32 = (int)local_648.p;
              if ((int)local_648.p <= local_648.jstride._4_4_) {
                do {
                  cell.vect[0] = iVar32;
                  cell.vect[1] = (int)lVar107;
                  cell.vect[2] = (int)lVar38;
                  for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                    puVar100 = (undefined8 *)
                               ((lVar38 - mfi_3.endIndex) *
                                CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8 +
                                (lVar107 - mfi_3.beginIndex) *
                                CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                                (long)mfi_3.currentIndex * -8 +
                               CONCAT44(mfi_3.m_fa._M_t.
                                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl._4_4_,
                                        (int)mfi_3.m_fa._M_t.
                                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl) + (long)iVar32 * 8);
                    for (lVar63 = 0; lVar63 != 3; lVar63 = lVar63 + 1) {
                      if ((lVar103 != lVar63) &&
                         ((cell.vect[lVar103] < dlo.vect[lVar103] ||
                          (dhi.vect[lVar103] < cell.vect[lVar103])))) {
                        *puVar100 = 0;
                      }
                      puVar100 = puVar100 + CONCAT44(mfi_3._28_4_,mfi_3.tile_size.vect[2]);
                    }
                    rhs = local_4f0;
                  }
                  bVar30 = iVar32 != local_648.jstride._4_4_;
                  iVar32 = iVar32 + 1;
                } while (bVar30);
              }
            }
          }
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
    }
    uVar56 = local_5e0;
    pFVar15 = &(vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_5e0]->super_FabArray<amrex::FArrayBox>;
    mfi.fabArray._0_4_ = 1;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )0x100000001;
    PVar141 = Geometry::periodicity(pGVar14);
    mfi_3.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = PVar141.period.vect[0];
    mfi_3.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = PVar141.period.vect[1];
    mfi_3.fabArray._0_4_ = PVar141.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (pFVar15,0,3,(IntVect *)&mfi,(Periodicity *)&mfi_3,false);
    ppMVar16 = (a_rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (((long)uVar56 <
         (long)(a_rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)ppMVar16 >> 3) &&
       (pMVar17 = ppMVar16[local_5e0], pMVar17 != (MultiFab *)0x0)) {
      mfi_3.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
      domain.smallend.vect[0] = 1;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
                ((BoxArray *)&mfi,
                 (DistributionMapping *)
                 ((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                 (int *)((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                        0x70),(int *)&mfi_3);
      uVar29._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           mfi.m_fa._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      auVar27._4_8_ = 0;
      auVar27._0_4_ = (uint)mfi.fabArray;
      mfi._0_12_ = auVar27 << 0x40;
      pMVar17 = rhcc.
                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      rhcc.
      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      .
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (MultiFab *)
           uVar29._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      if (pMVar17 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
        (**(code **)(*(long *)mfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 8)
        )();
      }
      uVar56 = local_5e0;
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&(rhcc.
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                  super_FabArray<amrex::FArrayBox>,0.0);
      MultiFab::Copy(rhcc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar56]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     (a_rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar56],0,0,1,0);
      pFVar15 = &(rhcc.
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar56]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>;
      mfi._0_12_ = Geometry::periodicity(pGVar14);
      FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar15,(Periodicity *)&mfi,false);
      pMVar17 = (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar56];
      mfi_3.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
      domain.smallend.vect._0_8_ = domain.smallend.vect._0_8_ & 0xffffffff00000000;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
                ((BoxArray *)&mfi,
                 (DistributionMapping *)
                 ((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                 (int *)((long)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                        0x70),(int *)&mfi_3);
      uVar29._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           mfi.m_fa._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      auVar28._4_8_ = 0;
      auVar28._0_4_ = (uint)mfi.fabArray;
      mfi._0_12_ = auVar28 << 0x40;
      pMVar17 = rhs_cc.
                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar56]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      rhs_cc.
      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      .
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar56]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (MultiFab *)
           uVar29._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      if (pMVar17 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar17->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
        (**(code **)(*(long *)mfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 8)
        )();
      }
    }
    dVar130 = (pGVar14->super_CoordSys).inv_dx[0];
    facy = (pGVar14->super_CoordSys).inv_dx[1];
    facz = (pGVar14->super_CoordSys).inv_dx[2];
    uVar24 = *(undefined8 *)((pGVar14->domain).smallend.vect + 2);
    bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar14->domain).bigend.vect >> 0x20);
    bx._20_8_ = *(undefined8 *)((pGVar14->domain).bigend.vect + 2);
    bx.smallend.vect._0_8_ = *(undefined8 *)(pGVar14->domain).smallend.vect;
    bx.smallend.vect[2] = (int)uVar24;
    bx.bigend.vect[0] = (int)((ulong)uVar24 >> 0x20);
    for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
      if ((bx.btype.itype >> ((uint)lVar38 & 0x1f) & 1) == 0) {
        piVar39 = bx.bigend.vect + lVar38;
        *piVar39 = *piVar39 + 1;
      }
    }
    bx.btype.itype = 7;
    pFVar18 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(this->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar73].
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ;
    plVar19 = *(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar73].
                         super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    lVar38 = *plVar19;
    local_484 = (undefined4)CONCAT71((int7)((ulong)plVar19 >> 8),1);
    if (lVar38 == 0) {
      local_398 = (FabArray<amrex::FArrayBox> *)0x0;
      this_07 = (EBFArrayBoxFactory *)0x0;
      local_330 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_340 = (MultiCutFab *)0x0;
    }
    else {
      this_06 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar38,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
      local_398 = (FabArray<amrex::FArrayBox> *)0x0;
      local_330 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_340 = (MultiCutFab *)0x0;
      this_07 = (EBFArrayBoxFactory *)0x0;
      if (this_06 != (EBFArrayBoxFactory *)0x0) {
        local_330 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_06);
        local_398 = &EBFArrayBoxFactory::getVolFrac(this_06)->super_FabArray<amrex::FArrayBox>;
        local_340 = EBFArrayBoxFactory::getBndryArea(this_06);
        local_484 = 0;
        this_07 = this_06;
      }
    }
    uVar73 = local_5e0;
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_integral).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_surface_integral).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    if (((local_5e0 != (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels - 1) &&
        ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
         super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_start[local_5e0] != 2 && (char)local_484 == '\0')) &&
       (bVar30 = EBFArrayBoxFactory::isAllRegular(this_07), !bVar30)) {
      Assert_host("ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2 || factory == nullptr || factory->isAllRegular()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                  ,0x3df,(char *)0x0);
    }
    local_2e4.smallend.vect[0] = CONCAT13(local_2e4.smallend.vect[0]._3_1_,0x10000);
    local_2e4.smallend.vect[1] = Gpu::Device::max_gpu_streams;
    local_2e4.bigend.vect[1] = DAT_007d7ef0;
    local_2e4.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
    local_2e4.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
    local_2e4.smallend.vect[0] = CONCAT22(local_2e4.smallend.vect[0]._2_2_,0x101);
    MFIter::MFIter(&mfi,(FabArrayBase *)
                        (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar73],(MFItInfo *)&local_2e4);
    dVar125 = dVar130 * 0.25;
    facy = facy * 0.25;
    facz = facz * 0.25;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox(&cccdom_pi,&mfi);
      uVar73 = local_5e0;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&mfi_3,
                 &(rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_5e0]->super_FabArray<amrex::FArrayBox>,&mfi
                );
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&domain,
                 &(vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar73]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_648,pFVar18,&mfi);
      local_400 = regular;
      if ((char)local_484 == '\0') {
        piVar39 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar39 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        this_02 = (local_330->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar39];
        aiStack_4dc[1] = cccdom_pi.bigend.vect[1];
        aiStack_4dc[2] = cccdom_pi.bigend.vect[2];
        IStack_4d0.itype = cccdom_pi.btype.itype;
        dlo.vect[0] = cccdom_pi.smallend.vect[0];
        dlo.vect[1] = cccdom_pi.smallend.vect[1];
        dlo.vect[2] = cccdom_pi.smallend.vect[2];
        aiStack_4dc[0] = cccdom_pi.bigend.vect[0];
        for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
          if ((IStack_4d0.itype >> ((uint)lVar38 & 0x1f) & 1) != 0) {
            aiStack_4dc[lVar38] = aiStack_4dc[lVar38] + -1;
          }
        }
        IStack_4d0.itype = 0;
        result.btype.itype = 0;
        result.smallend.vect[0] = cccdom_pi.smallend.vect[0];
        result.smallend.vect[1] = cccdom_pi.smallend.vect[1];
        result.smallend.vect[2] = cccdom_pi.smallend.vect[2] + -1;
        result.bigend.vect[0] = aiStack_4dc[0] + 1;
        result.smallend.vect[1] = result.smallend.vect[1] + -1;
        result.smallend.vect[0] = result.smallend.vect[0] + -1;
        result.bigend.vect[1] = aiStack_4dc[1] + 1;
        result.bigend.vect[2] = aiStack_4dc[2] + 1;
        local_400 = EBCellFlagFab::getType(this_02,&result);
        iVar42 = cccdom_pi.bigend.vect[1];
        iVar32 = cccdom_pi.bigend.vect[0];
        if (local_400 == singlevalued) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&dlo,local_398,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&dhi,
                     (FabArray<amrex::FArrayBox> *)
                     this_00.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
          lVar107 = (long)cccdom_pi.smallend.vect[0];
          lVar38 = lVar107 * 8;
          local_3fc = cccdom_pi.smallend.vect[2] + -1;
          for (lVar103 = (long)cccdom_pi.smallend.vect[2]; iVar32 = (int)lVar103,
              iVar32 <= cccdom_pi.bigend.vect[2]; lVar103 = lVar103 + 1) {
            lVar40 = (long)local_3fc;
            iVar42 = cccdom_pi.smallend.vect[1] + -1;
            for (lVar63 = (long)cccdom_pi.smallend.vect[1]; iVar97 = (int)lVar63,
                iVar97 <= cccdom_pi.bigend.vect[1]; lVar63 = lVar63 + 1) {
              lVar92 = (long)iVar42;
              local_5d0 = CONCAT44(local_5d0._4_4_,local_538.arr[1]);
              local_5d8 = CONCAT44(local_5d8._4_4_,local_528.arr[2]);
              lVar76 = CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]) * 8;
              lVar55 = (lVar40 - (int)local_790) * lVar76;
              lVar76 = (lVar103 - (int)local_790) * lVar76;
              lVar111 = CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]) * 8;
              lVar60 = (lVar92 - (int)local_794) * lVar111;
              lVar111 = (lVar63 - (int)local_794) * lVar111;
              lVar96 = lVar55 + lVar60;
              lVar60 = lVar60 + lVar76;
              lVar55 = lVar55 + lVar111;
              lVar111 = lVar111 + lVar76;
              lVar76 = CONCAT44(uStack_79c,domain.btype.itype);
              lVar41 = lVar76 * 0x10;
              lVar46 = (long)(int)local_798;
              lVar88 = domain.smallend.vect._0_8_ + lVar38;
              lVar101 = lVar96 + lVar41 + lVar46 * -8 + lVar88;
              local_490 = lVar96 + lVar76 * 8 + lVar46 * -8 + lVar88;
              lVar70 = lVar96 + lVar46 * -8 + lVar88;
              local_4a8 = lVar60 + lVar41 + lVar46 * -8 + lVar88;
              local_498 = lVar60 + lVar76 * 8 + lVar46 * -8 + lVar88;
              lVar110 = lVar60 + lVar46 * -8 + lVar88;
              lVar89 = lVar55 + lVar41 + lVar46 * -8 + lVar88;
              local_4a0 = lVar55 + lVar76 * 8 + lVar46 * -8 + lVar88;
              lVar54 = lVar55 + lVar46 * -8 + lVar88;
              lVar47 = lVar41 + lVar111 + lVar46 * -8 + lVar88;
              lVar82 = lVar111 + lVar76 * 8 + lVar46 * -8 + lVar88;
              lVar88 = lVar111 + lVar46 * -8 + lVar88;
              lVar65 = (lVar40 - (int)local_3d0) * local_3e8 * 8;
              lVar76 = (lVar103 - (int)local_3d0) * local_3e8 * 8;
              lVar69 = CONCAT44(uStack_3ec,dhi.vect[2]) * 8;
              lVar60 = (lVar92 - (int)local_3d4) * lVar69;
              lVar69 = (lVar63 - (int)local_3d4) * lVar69;
              lVar96 = lVar65 + lVar60;
              lVar60 = lVar60 + lVar76;
              lVar65 = lVar65 + lVar69;
              lVar69 = lVar69 + lVar76;
              lVar81 = (long)local_3d8;
              lVar84 = local_3e0 * 0x30;
              lVar79 = local_3e0 * 0x38;
              lVar59 = local_3e0 * 0x40;
              lVar52 = local_3e0 * 0x10;
              lVar71 = dhi.vect._0_8_ + lVar38;
              lVar76 = lVar96 + lVar84 + lVar81 * -8 + lVar71;
              lVar111 = lVar96 + lVar79 + lVar81 * -8 + lVar71;
              lVar46 = lVar96 + lVar81 * -8 + lVar71;
              lVar41 = lVar96 + lVar59 + lVar81 * -8 + lVar71;
              lVar55 = lVar96 + lVar52 + lVar81 * -8 + lVar71;
              lVar96 = lVar96 + local_3e0 * 8 + lVar81 * -8 + lVar71;
              lVar48 = lVar60 + lVar84 + lVar81 * -8 + lVar71;
              lVar108 = lVar60 + lVar79 + lVar81 * -8 + lVar71;
              lVar53 = lVar60 + lVar81 * -8 + lVar71;
              lVar93 = lVar60 + lVar59 + lVar81 * -8 + lVar71;
              lVar95 = lVar60 + lVar52 + lVar81 * -8 + lVar71;
              lVar60 = lVar60 + local_3e0 * 8 + lVar81 * -8 + lVar71;
              lVar90 = lVar65 + lVar84 + lVar81 * -8 + lVar71;
              lVar77 = lVar65 + lVar79 + lVar81 * -8 + lVar71;
              lVar80 = lVar65 + lVar81 * -8 + lVar71;
              lVar83 = lVar65 + lVar59 + lVar81 * -8 + lVar71;
              lVar94 = lVar65 + lVar52 + lVar81 * -8 + lVar71;
              lVar65 = lVar65 + local_3e0 * 8 + lVar81 * -8 + lVar71;
              lVar64 = lVar84 + lVar69 + lVar81 * -8 + lVar71;
              lVar74 = lVar79 + lVar69 + lVar81 * -8 + lVar71;
              lVar84 = lVar69 + lVar81 * -8 + lVar71;
              lVar105 = lVar59 + lVar69 + lVar81 * -8 + lVar71;
              lVar52 = lVar52 + lVar69 + lVar81 * -8 + lVar71;
              lVar71 = lVar69 + local_3e0 * 8 + lVar81 * -8 + lVar71;
              lVar69 = CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 8;
              lVar75 = (lVar40 - local_4c0) * lVar69;
              lVar69 = (lVar103 - local_4c0) * lVar69;
              lVar81 = CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 8;
              lVar79 = (lVar92 - local_4c4) * lVar81;
              lVar81 = (lVar63 - local_4c4) * lVar81;
              lVar92 = (long)local_4c8;
              lVar59 = dlo.vect._0_8_ + lVar38;
              lVar109 = lVar75 + lVar79 + lVar92 * -8 + lVar59;
              lVar79 = lVar79 + lVar69 + lVar92 * -8 + lVar59;
              lVar75 = lVar75 + lVar81 + lVar92 * -8 + lVar59;
              lVar59 = lVar81 + lVar69 + lVar92 * -8 + lVar59;
              for (lVar69 = 0; lVar107 + lVar69 <= (long)cccdom_pi.bigend.vect[0];
                  lVar69 = lVar69 + 1) {
                dVar129 = 0.0;
                if (*(int *)((lVar63 - local_648.begin.y) *
                             CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 4 +
                             (lVar103 - local_648.begin.z) *
                             CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 4 +
                             (long)local_648.begin.x * -4 +
                             CONCAT44(local_648.p._4_4_,(int)local_648.p) + lVar107 * 4 + lVar69 * 4
                            ) == 0) {
                  dVar129 = 1.0;
                  if (((local_528.arr[0] == Neumann) ||
                      (dVar134 = dVar129, local_528.arr[0] == inflow)) &&
                     (dVar134 = 1.0, (long)bx.smallend.vect[0] + -lVar107 == lVar69)) {
                    dVar134 = 0.0;
                  }
                  if (((local_538.arr[0] == Neumann) ||
                      (dVar126 = dVar129, local_538.arr[0] == inflow)) &&
                     (dVar126 = 1.0, (long)bx.bigend.vect[0] + -lVar107 == lVar69)) {
                    dVar126 = 0.0;
                  }
                  if (local_528.arr[1] == Neumann) {
                    dVar131 = dVar129;
                    if (bx.smallend.vect[1] == iVar97) {
LAB_00658f15:
                      dVar131 = 0.0;
                    }
                  }
                  else {
                    dVar131 = 1.0;
                    if (bx.smallend.vect[1] == iVar97 && local_528.arr[1] == inflow)
                    goto LAB_00658f15;
                  }
                  if (local_538.arr[1] == Neumann) {
                    dVar119 = dVar129;
                    if (bx.bigend.vect[1] == iVar97) {
LAB_00658f47:
                      dVar119 = 0.0;
                    }
                  }
                  else {
                    dVar119 = 1.0;
                    if (bx.bigend.vect[1] == iVar97 && local_538.arr[1] == inflow)
                    goto LAB_00658f47;
                  }
                  if (local_528.arr[2] == Neumann) {
                    dVar132 = dVar129;
                    if (bx.smallend.vect[2] == iVar32) {
LAB_00658f7b:
                      dVar132 = 0.0;
                    }
                  }
                  else {
                    dVar132 = 1.0;
                    if (bx.smallend.vect[2] == iVar32 && local_528.arr[2] == inflow)
                    goto LAB_00658f7b;
                  }
                  if (local_538.arr[2] == Neumann) {
                    if (bx.bigend.vect[2] == iVar32) {
LAB_00658fb4:
                      dVar129 = 0.0;
                    }
                  }
                  else {
                    dVar129 = 1.0;
                    if (bx.bigend.vect[2] == iVar32 && local_538.arr[2] == inflow)
                    goto LAB_00658fb4;
                  }
                  dVar2 = *(double *)(lVar60 + -8 + lVar69 * 8);
                  dVar113 = *(double *)(lVar60 + lVar69 * 8);
                  dVar3 = *(double *)(lVar79 + -8 + lVar69 * 8);
                  dVar4 = *(double *)(lVar79 + lVar69 * 8);
                  dVar120 = *(double *)(lVar95 + -8 + lVar69 * 8);
                  dVar120 = dVar120 + dVar120;
                  dVar121 = *(double *)(lVar95 + lVar69 * 8);
                  dVar113 = dVar113 + dVar113;
                  dVar121 = dVar121 + dVar121;
                  dVar114 = *(double *)(lVar71 + -8 + lVar69 * 8);
                  dVar5 = *(double *)(lVar59 + -8 + lVar69 * 8);
                  dVar114 = dVar114 + dVar114;
                  dVar139 = *(double *)(lVar84 + -8 + lVar69 * 8);
                  local_5f8 = dVar139 + dVar139 + dVar5;
                  local_608 = local_5f8 - dVar114;
                  dVar139 = *(double *)(lVar52 + -8 + lVar69 * 8);
                  dVar139 = dVar139 + dVar139;
                  dVar115 = *(double *)(lVar71 + lVar69 * 8) * -2.0;
                  dVar6 = *(double *)(lVar59 + lVar69 * 8);
                  dVar127 = *(double *)(lVar52 + lVar69 * 8) * -2.0;
                  dVar116 = *(double *)(lVar96 + -8 + lVar69 * 8) * -2.0;
                  dVar7 = *(double *)(lVar109 + -8 + lVar69 * 8);
                  dVar122 = *(double *)(lVar55 + -8 + lVar69 * 8) * -2.0;
                  dVar117 = *(double *)(lVar96 + lVar69 * 8);
                  dVar117 = dVar117 + dVar117;
                  dVar118 = *(double *)(lVar46 + lVar69 * 8);
                  dVar8 = *(double *)(lVar109 + lVar69 * 8);
                  dVar133 = (dVar118 + dVar118) - dVar8;
                  dVar118 = *(double *)(lVar55 + lVar69 * 8);
                  dVar118 = dVar118 + dVar118;
                  dVar123 = *(double *)(lVar65 + -8 + lVar69 * 8);
                  dVar123 = dVar123 + dVar123;
                  dVar9 = *(double *)(lVar80 + -8 + lVar69 * 8);
                  dVar10 = *(double *)(lVar75 + -8 + lVar69 * 8);
                  dVar124 = *(double *)(lVar94 + -8 + lVar69 * 8);
                  dVar124 = dVar124 + dVar124;
                  dVar128 = *(double *)(lVar65 + lVar69 * 8);
                  dVar128 = dVar128 + dVar128;
                  dVar138 = *(double *)(lVar80 + lVar69 * 8);
                  dVar138 = dVar138 + dVar138;
                  dVar11 = *(double *)(lVar75 + lVar69 * 8);
                  dVar137 = *(double *)(lVar94 + lVar69 * 8);
                  dVar137 = dVar137 + dVar137;
                  dVar12 = *(double *)(lVar53 + -8 + lVar69 * 8);
                  dVar135 = *(double *)(lVar53 + lVar69 * 8);
                  dVar135 = dVar135 + dVar135;
                  dVar136 = *(double *)(lVar84 + lVar69 * 8);
                  dVar140 = dVar6 - (dVar136 + dVar136);
                  dVar136 = *(double *)(lVar46 + -8 + lVar69 * 8) * -2.0 - dVar7;
                  dVar129 = ((*(double *)(lVar90 + lVar69 * 8) * -4.0 + (dVar138 - dVar11) + dVar128
                             ) * *(double *)(lVar89 + lVar69 * 8) * dVar126 * dVar119 +
                            (*(double *)(lVar90 + -8 + lVar69 * 8) * 4.0 +
                            (dVar9 * -2.0 - dVar10) + dVar123) *
                            *(double *)(lVar89 + -8 + lVar69 * 8) * dVar134 * dVar119 +
                            (*(double *)(lVar76 + lVar69 * 8) * 4.0 + (dVar133 - dVar117)) *
                            *(double *)(lVar101 + lVar69 * 8) * dVar126 * dVar131 +
                            (*(double *)(lVar76 + -8 + lVar69 * 8) * -4.0 + dVar136 + dVar116) *
                            *(double *)(lVar101 + -8 + lVar69 * 8) * dVar134 * dVar131 +
                            (*(double *)(lVar64 + lVar69 * 8) * 4.0 + dVar140 + dVar115) *
                            *(double *)(lVar47 + lVar69 * 8) * dVar126 * dVar119 +
                            (*(double *)(lVar64 + -8 + lVar69 * 8) * -4.0 + local_608) *
                            *(double *)(lVar47 + -8 + lVar69 * 8) * dVar134 * dVar119 +
                            (*(double *)(lVar48 + -8 + lVar69 * 8) * 4.0 +
                            dVar2 + dVar2 + dVar12 + dVar12 + dVar3) *
                            *(double *)(local_4a8 + -8 + lVar69 * 8) * dVar134 * dVar131 +
                            (*(double *)(lVar48 + lVar69 * 8) * -4.0 + (dVar4 - dVar135) + dVar113)
                            * *(double *)(local_4a8 + lVar69 * 8) * dVar126 * dVar131) * facz +
                            ((*(double *)(lVar83 + lVar69 * 8) * -4.0 + (dVar11 - dVar128) + dVar137
                             ) * *(double *)(lVar54 + lVar69 * 8) * dVar119 * dVar132 +
                            (*(double *)(lVar83 + -8 + lVar69 * 8) * 4.0 +
                            ((dVar123 - dVar10) - dVar124)) * *(double *)(lVar54 + -8 + lVar69 * 8)
                            * dVar119 * dVar132 +
                            (*(double *)(lVar41 + lVar69 * 8) * 4.0 + dVar117 + dVar8 + dVar118) *
                            *(double *)(lVar70 + lVar69 * 8) * dVar131 * dVar132 +
                            (*(double *)(lVar41 + -8 + lVar69 * 8) * -4.0 +
                            (dVar116 - dVar7) + dVar122) * *(double *)(lVar70 + -8 + lVar69 * 8) *
                            dVar131 * dVar132 +
                            (*(double *)(lVar105 + lVar69 * 8) * 4.0 + dVar115 + dVar6 + dVar127) *
                            *(double *)(lVar88 + lVar69 * 8) * dVar119 * dVar129 +
                            (*(double *)(lVar105 + -8 + lVar69 * 8) * -4.0 +
                            (dVar114 - dVar5) + dVar139) * *(double *)(lVar88 + -8 + lVar69 * 8) *
                            dVar119 * dVar129 +
                            (*(double *)(lVar93 + -8 + lVar69 * 8) * 4.0 +
                            (dVar2 * -2.0 - dVar3) + dVar120) *
                            *(double *)(lVar110 + -8 + lVar69 * 8) * dVar131 * dVar129 +
                            (*(double *)(lVar93 + lVar69 * 8) * -4.0 + ((dVar113 + dVar4) - dVar121)
                            ) * *(double *)(lVar110 + lVar69 * 8) * dVar131 * dVar129) * dVar125 +
                            ((*(double *)(lVar77 + lVar69 * 8) * -4.0 + (dVar11 - dVar138) + dVar137
                             ) * *(double *)(local_4a0 + lVar69 * 8) * dVar126 * dVar132 +
                            (*(double *)(lVar77 + -8 + lVar69 * 8) * 4.0 +
                            dVar9 + dVar9 + dVar10 + dVar124) *
                            *(double *)((local_4a0 - 8) + lVar69 * 8) * dVar134 * dVar132 +
                            (*(double *)(lVar111 + lVar69 * 8) * 4.0 + (dVar133 - dVar118)) *
                            *(double *)(local_490 + lVar69 * 8) * dVar126 * dVar132 +
                            (*(double *)(lVar111 + -8 + lVar69 * 8) * -4.0 + dVar122 + dVar136) *
                            *(double *)((local_490 - 8) + lVar69 * 8) * dVar134 * dVar132 +
                            (*(double *)(lVar74 + lVar69 * 8) * 4.0 + dVar127 + dVar140) *
                            *(double *)(lVar82 + lVar69 * 8) * dVar126 * dVar129 +
                            (*(double *)(lVar74 + -8 + lVar69 * 8) * -4.0 + (local_5f8 - dVar139)) *
                            *(double *)(lVar82 + -8 + lVar69 * 8) * dVar134 * dVar129 +
                            (*(double *)(lVar108 + -8 + lVar69 * 8) * 4.0 +
                            (dVar12 * -2.0 - dVar3) + dVar120) *
                            *(double *)((local_498 - 8) + lVar69 * 8) * dVar134 * dVar129 +
                            (*(double *)(lVar108 + lVar69 * 8) * -4.0 + (dVar135 - dVar4) + dVar121)
                            * *(double *)(local_498 + lVar69 * 8) * dVar126 * dVar129) * facy;
                }
                *(double *)
                 (((long)iVar97 - (long)mfi_3.beginIndex) *
                  CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                  CONCAT44(mfi_3.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                           (int)mfi_3.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                  ((long)iVar32 - (long)mfi_3.endIndex) *
                  CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8 +
                  (long)mfi_3.currentIndex * -8 + lVar38 + lVar69 * 8) = dVar129;
              }
              iVar42 = iVar42 + 1;
            }
            local_3fc = local_3fc + 1;
          }
          this_03.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                &(this->m_eb_vel_dot_n).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          rhs = local_4f0;
          if (this_03.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&cell,
                       (FabArray<amrex::FArrayBox> *)
                       this_03.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
            MultiCutFab::const_array((Array4<const_double> *)&result_1,local_340,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&bx_2,
                       (FabArray<amrex::FArrayBox> *)
                       this_01.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
            lVar107 = (long)cccdom_pi.smallend.vect[0];
            lVar38 = lVar107 * 8;
            iVar32 = cccdom_pi.smallend.vect[2] + -1;
            local_5d0 = CONCAT44(local_5d0._4_4_,cccdom_pi.smallend.vect[1] + -1);
            for (lVar103 = (long)cccdom_pi.smallend.vect[2]; rhs = local_4f0,
                (int)lVar103 <= cccdom_pi.bigend.vect[2]; lVar103 = lVar103 + 1) {
              lVar40 = (long)iVar32;
              iVar42 = cccdom_pi.smallend.vect[1] + -1;
              for (lVar63 = (long)cccdom_pi.smallend.vect[1];
                  (int)lVar63 <= cccdom_pi.bigend.vect[1]; lVar63 = lVar63 + 1) {
                lVar83 = (long)iVar42;
                lVar52 = (long)local_558[0].x;
                lVar79 = CONCAT44(uStack_55c,bx_2.btype.itype);
                lVar76 = CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]) * 8;
                lVar71 = (lVar40 - local_558[0].z) * lVar76;
                lVar53 = CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]) * 8;
                lVar60 = (lVar83 - local_558[0].y) * lVar53;
                lVar96 = lVar71 + lVar60;
                lVar88 = lVar79 * 0x30;
                lVar84 = lVar79 * 0x28;
                lVar80 = lVar79 * 0x18;
                lVar76 = (lVar103 - local_558[0].z) * lVar76;
                lVar60 = lVar60 + lVar76;
                lVar53 = (lVar63 - local_558[0].y) * lVar53;
                lVar71 = lVar71 + lVar53;
                lVar53 = lVar53 + lVar76;
                lVar48 = lVar79 * 0x20;
                lVar64 = lVar79 * 0x10;
                lVar47 = bx_2.smallend.vect._0_8_ + lVar38;
                local_608 = (double)(lVar96 + lVar88 + lVar52 * -8 + lVar47);
                lVar76 = lVar96 + lVar48 + lVar52 * -8 + lVar47;
                lVar111 = lVar96 + lVar84 + lVar52 * -8 + lVar47;
                lVar46 = lVar96 + lVar64 + lVar52 * -8 + lVar47;
                lVar41 = lVar80 + lVar96 + lVar52 * -8 + lVar47;
                lVar55 = lVar96 + lVar79 * 8 + lVar52 * -8 + lVar47;
                local_5f8 = (double)(lVar96 + lVar52 * -8 + lVar47);
                lVar94 = lVar60 + lVar88 + lVar52 * -8 + lVar47;
                lVar101 = lVar60 + lVar48 + lVar52 * -8 + lVar47;
                lVar95 = lVar60 + lVar84 + lVar52 * -8 + lVar47;
                lVar105 = lVar60 + lVar64 + lVar52 * -8 + lVar47;
                lVar59 = lVar60 + lVar80 + lVar52 * -8 + lVar47;
                lVar96 = lVar60 + lVar79 * 8 + lVar52 * -8 + lVar47;
                lVar60 = lVar60 + lVar52 * -8 + lVar47;
                lVar93 = lVar71 + lVar88 + lVar52 * -8 + lVar47;
                lVar90 = lVar71 + lVar48 + lVar52 * -8 + lVar47;
                lVar89 = lVar84 + lVar71 + lVar52 * -8 + lVar47;
                lVar77 = lVar71 + lVar64 + lVar52 * -8 + lVar47;
                lVar69 = lVar80 + lVar71 + lVar52 * -8 + lVar47;
                lVar65 = lVar79 * 8 + lVar71 + lVar52 * -8 + lVar47;
                lVar71 = lVar71 + lVar52 * -8 + lVar47;
                lVar88 = lVar88 + lVar53 + lVar52 * -8 + lVar47;
                lVar110 = lVar48 + lVar53 + lVar52 * -8 + lVar47;
                lVar84 = lVar84 + lVar53 + lVar52 * -8 + lVar47;
                lVar74 = lVar64 + lVar53 + lVar52 * -8 + lVar47;
                lVar80 = lVar80 + lVar53 + lVar52 * -8 + lVar47;
                lVar79 = lVar53 + lVar79 * 8 + lVar52 * -8 + lVar47;
                lVar47 = lVar53 + lVar52 * -8 + lVar47;
                lVar52 = CONCAT44(iStack_36c,local_370) * 8;
                lVar54 = (lVar40 - local_358) * lVar52;
                lVar52 = (lVar103 - local_358) * lVar52;
                lVar48 = CONCAT44(iStack_374,cell.vect[2]) * 8;
                lVar81 = (lVar83 - local_35c) * lVar48;
                lVar48 = (lVar63 - local_35c) * lVar48;
                lVar53 = (long)local_360;
                lVar64 = CONCAT44(cell.vect[1],cell.vect[0]) + lVar38;
                lVar92 = lVar54 + lVar81 + lVar53 * -8 + lVar64;
                lVar82 = lVar81 + lVar52 + lVar53 * -8 + lVar64;
                lVar70 = lVar54 + lVar48 + lVar53 * -8 + lVar64;
                lVar64 = lVar48 + lVar52 + lVar53 * -8 + lVar64;
                lVar53 = CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 8;
                lVar75 = (lVar40 - local_5a0) * lVar53;
                lVar53 = (lVar103 - local_5a0) * lVar53;
                lVar81 = CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 8;
                lVar52 = (lVar83 - local_5a4) * lVar81;
                lVar81 = (lVar63 - local_5a4) * lVar81;
                lVar48 = (long)(int)local_5a8;
                lVar54 = result_1.smallend.vect._0_8_ + lVar38;
                lVar83 = lVar75 + lVar52 + lVar48 * -8 + lVar54;
                lVar52 = lVar52 + lVar53 + lVar48 * -8 + lVar54;
                lVar75 = lVar75 + lVar81 + lVar48 * -8 + lVar54;
                lVar54 = lVar81 + lVar53 + lVar48 * -8 + lVar54;
                lVar48 = (lVar63 - mfi_3.beginIndex) *
                         CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                         (lVar103 - mfi_3.endIndex) *
                         CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8 +
                         (long)mfi_3.currentIndex * -8 +
                         CONCAT44(mfi_3.m_fa._M_t.
                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                                  _4_4_,(int)mfi_3.m_fa._M_t.
                                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl) + lVar38;
                for (lVar53 = 0; lVar107 + lVar53 <= (long)cccdom_pi.bigend.vect[0];
                    lVar53 = lVar53 + 1) {
                  if (*(int *)((lVar63 - local_648.begin.y) *
                               CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 4 +
                               (lVar103 - local_648.begin.z) *
                               CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 4 +
                               (long)local_648.begin.x * -4 +
                               CONCAT44(local_648.p._4_4_,(int)local_648.p) + lVar107 * 4 +
                              lVar53 * 4) == 0) {
                    dVar129 = *(double *)(lVar60 + -8 + lVar53 * 8);
                    dVar134 = *(double *)(lVar60 + lVar53 * 8);
                    dVar126 = *(double *)(lVar96 + -8 + lVar53 * 8);
                    dVar131 = *(double *)(lVar96 + lVar53 * 8);
                    dVar119 = *(double *)(lVar105 + -8 + lVar53 * 8);
                    dVar132 = *(double *)(lVar105 + lVar53 * 8);
                    dVar2 = *(double *)(lVar47 + -8 + lVar53 * 8);
                    dVar113 = *(double *)(lVar47 + lVar53 * 8);
                    dVar3 = *(double *)(lVar79 + -8 + lVar53 * 8);
                    dVar4 = *(double *)(lVar79 + lVar53 * 8);
                    dVar120 = *(double *)(lVar74 + -8 + lVar53 * 8);
                    dVar121 = *(double *)(lVar74 + lVar53 * 8);
                    dVar114 = *(double *)((long)local_5f8 + -8 + lVar53 * 8);
                    dVar5 = *(double *)((long)local_5f8 + lVar53 * 8);
                    dVar139 = *(double *)(lVar55 + -8 + lVar53 * 8);
                    dVar6 = *(double *)(lVar55 + lVar53 * 8);
                    dVar7 = *(double *)(lVar46 + -8 + lVar53 * 8);
                    dVar117 = *(double *)(lVar46 + lVar53 * 8);
                    dVar118 = *(double *)(lVar71 + -8 + lVar53 * 8);
                    dVar8 = *(double *)(lVar71 + lVar53 * 8);
                    dVar123 = *(double *)(lVar65 + -8 + lVar53 * 8);
                    dVar9 = *(double *)(lVar65 + lVar53 * 8);
                    dVar10 = *(double *)(lVar77 + -8 + lVar53 * 8);
                    dVar124 = *(double *)(lVar77 + lVar53 * 8);
                    *(double *)(lVar48 + lVar53 * 8) =
                         ((*(double *)(lVar93 + lVar53 * 8) * 8.0 +
                          *(double *)(lVar90 + lVar53 * 8) * -4.0 +
                          *(double *)(lVar89 + lVar53 * 8) * -4.0 +
                          dVar124 + dVar124 +
                          *(double *)(lVar69 + lVar53 * 8) * 4.0 +
                          ((*(double *)(lVar75 + lVar53 * 8) - (dVar8 + dVar8)) - (dVar9 + dVar9)))
                          * *(double *)(lVar70 + lVar53 * 8) +
                         (*(double *)(lVar93 + -8 + lVar53 * 8) * -8.0 +
                         *(double *)(lVar90 + -8 + lVar53 * 8) * 4.0 +
                         *(double *)(lVar89 + -8 + lVar53 * 8) * -4.0 +
                         dVar10 + dVar10 +
                         *(double *)(lVar69 + -8 + lVar53 * 8) * -4.0 +
                         ((dVar118 + dVar118 + *(double *)(lVar75 + -8 + lVar53 * 8)) -
                         (dVar123 + dVar123))) * *(double *)(lVar70 + -8 + lVar53 * 8) +
                         (*(double *)((long)local_608 + lVar53 * 8) * -8.0 +
                         *(double *)(lVar76 + lVar53 * 8) * -4.0 +
                         *(double *)(lVar111 + lVar53 * 8) * 4.0 +
                         dVar117 + dVar117 +
                         *(double *)(lVar41 + lVar53 * 8) * -4.0 +
                         dVar6 + dVar6 + (*(double *)(lVar83 + lVar53 * 8) - (dVar5 + dVar5))) *
                         *(double *)(lVar92 + lVar53 * 8) +
                         (*(double *)((long)local_608 + -8 + lVar53 * 8) * 8.0 +
                         *(double *)(lVar76 + -8 + lVar53 * 8) * 4.0 +
                         *(double *)(lVar111 + -8 + lVar53 * 8) * 4.0 +
                         dVar7 + dVar7 +
                         *(double *)(lVar41 + -8 + lVar53 * 8) * 4.0 +
                         dVar139 + dVar139 +
                         dVar114 + dVar114 + *(double *)(lVar83 + -8 + lVar53 * 8)) *
                         *(double *)(lVar92 + -8 + lVar53 * 8) +
                         (*(double *)(lVar88 + lVar53 * 8) * -8.0 +
                         *(double *)(lVar110 + lVar53 * 8) * 4.0 +
                         *(double *)(lVar84 + lVar53 * 8) * 4.0 +
                         ((*(double *)(lVar80 + lVar53 * 8) * 4.0 +
                          ((*(double *)(lVar54 + lVar53 * 8) - (dVar113 + dVar113)) -
                          (dVar4 + dVar4))) - (dVar121 + dVar121))) *
                         *(double *)(lVar64 + lVar53 * 8) +
                         (*(double *)(lVar88 + -8 + lVar53 * 8) * 8.0 +
                         *(double *)(lVar110 + -8 + lVar53 * 8) * -4.0 +
                         *(double *)(lVar84 + -8 + lVar53 * 8) * 4.0 +
                         ((*(double *)(lVar80 + -8 + lVar53 * 8) * -4.0 +
                          ((dVar2 + dVar2 + *(double *)(lVar54 + -8 + lVar53 * 8)) - (dVar3 + dVar3)
                          )) - (dVar120 + dVar120))) * *(double *)(lVar64 + -8 + lVar53 * 8) +
                         (*(double *)(lVar94 + -8 + lVar53 * 8) * -8.0 +
                         *(double *)(lVar101 + -8 + lVar53 * 8) * -4.0 +
                         *(double *)(lVar95 + -8 + lVar53 * 8) * -4.0 +
                         ((*(double *)(lVar59 + -8 + lVar53 * 8) * 4.0 +
                          dVar126 + dVar126 +
                          dVar129 + dVar129 + *(double *)(lVar52 + -8 + lVar53 * 8)) -
                         (dVar119 + dVar119))) * *(double *)(lVar82 + -8 + lVar53 * 8) +
                         (*(double *)(lVar94 + lVar53 * 8) * 8.0 +
                         *(double *)(lVar101 + lVar53 * 8) * 4.0 +
                         *(double *)(lVar95 + lVar53 * 8) * -4.0 +
                         ((*(double *)(lVar59 + lVar53 * 8) * -4.0 +
                          dVar131 + dVar131 +
                          (*(double *)(lVar52 + lVar53 * 8) - (dVar134 + dVar134))) -
                         (dVar132 + dVar132))) * *(double *)(lVar82 + lVar53 * 8)) * dVar130 * 0.125
                         + *(double *)(lVar48 + lVar53 * 8);
                  }
                }
                iVar42 = iVar42 + 1;
              }
              iVar32 = iVar32 + 1;
            }
          }
        }
        else {
          if (local_400 != covered) goto LAB_00657e45;
          iVar97 = cccdom_pi.smallend.vect[0];
          lVar107 = (long)cccdom_pi.smallend.vect[0];
          iVar37 = cccdom_pi.smallend.vect[1];
          iVar45 = cccdom_pi.bigend.vect[2];
          lVar38 = (long)cccdom_pi.smallend.vect[1];
          uVar31 = cccdom_pi.bigend.vect[0] - cccdom_pi.smallend.vect[0];
          for (iVar67 = cccdom_pi.smallend.vect[2]; rhs = local_4f0, iVar67 <= iVar45;
              iVar67 = iVar67 + 1) {
            lVar103 = CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8;
            pvVar104 = (void *)((lVar38 - mfi_3.beginIndex) * lVar103 +
                                (long)(iVar67 - mfi_3.endIndex) *
                                CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8 +
                                (long)mfi_3.currentIndex * -8 +
                               CONCAT44(mfi_3.m_fa._M_t.
                                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl._4_4_,
                                        (int)mfi_3.m_fa._M_t.
                                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl) + lVar107 * 8);
            for (iVar57 = iVar37; iVar57 <= iVar42; iVar57 = iVar57 + 1) {
              if (iVar97 <= iVar32) {
                memset(pvVar104,0,(ulong)uVar31 * 8 + 8);
              }
              pvVar104 = (void *)((long)pvVar104 + lVar103);
            }
          }
        }
      }
      else {
LAB_00657e45:
        lVar38 = (long)cccdom_pi.smallend.vect[0];
        local_490 = (ulong)cccdom_pi.smallend.vect[1];
        local_498 = -lVar38;
        local_4a0 = lVar38 * 4;
        local_7ec = cccdom_pi.smallend.vect[2] + -1;
        local_5d0 = CONCAT44(local_5d0._4_4_,cccdom_pi.bigend.vect[0]);
        for (lVar107 = (long)cccdom_pi.smallend.vect[2]; iVar32 = (int)lVar107,
            iVar32 <= cccdom_pi.bigend.vect[2]; lVar107 = lVar107 + 1) {
          lVar103 = CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 4;
          lVar63 = (local_490 - (long)local_648.begin.y) * lVar103 +
                   (lVar107 - local_648.begin.z) *
                   CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 4 +
                   (long)local_648.begin.x * -4 +
                   CONCAT44(local_648.p._4_4_,(int)local_648.p) + local_4a0;
          iVar42 = cccdom_pi.smallend.vect[1] + -1;
          for (uVar73 = local_490; (long)uVar73 <= (long)cccdom_pi.bigend.vect[1];
              uVar73 = uVar73 + 1) {
            if (cccdom_pi.smallend.vect[0] <= cccdom_pi.bigend.vect[0]) {
              local_5f8 = (double)CONCAT44(local_5f8._4_4_,local_538.arr[1]);
              local_608 = (double)CONCAT44(local_608._4_4_,local_528.arr[2]);
              local_5d8 = (uVar73 - (long)mfi_3.beginIndex) *
                          CONCAT44(mfi_3.fabArray._4_4_,(int)mfi_3.fabArray) * 8 +
                          (lVar107 - mfi_3.endIndex) *
                          CONCAT44(mfi_3.tile_size.vect[1],mfi_3.tile_size.vect[0]) * 8 +
                          (long)mfi_3.currentIndex * -8 +
                          CONCAT44(mfi_3.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                   ._4_4_,(int)mfi_3.m_fa._M_t.
                                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                               _M_head_impl) + lVar38 * 8;
              lVar40 = CONCAT44(domain.bigend.vect[2],domain.bigend.vect[1]);
              lVar46 = (int)(~local_790 + iVar32) * lVar40;
              lVar111 = (int)(iVar32 - local_790) * lVar40;
              lVar60 = (lVar107 - (int)local_790) * lVar40 * 8;
              lVar76 = (long)(int)(local_7ec - local_790) * lVar40 * 8;
              lVar96 = CONCAT44(domain.bigend.vect[0],domain.smallend.vect[2]);
              lVar84 = (long)(int)(iVar42 - local_794) * lVar96 * 8;
              lVar71 = lVar96 * 8 * (uVar73 - (long)(int)local_794);
              lVar40 = lVar60 + lVar84;
              lVar84 = lVar84 + lVar76;
              lVar60 = lVar60 + lVar71;
              lVar71 = lVar71 + lVar76;
              lVar76 = CONCAT44(uStack_79c,domain.btype.itype);
              lVar65 = lVar76 * 0x10;
              lVar41 = (long)(int)local_798;
              lVar55 = domain.smallend.vect._0_8_ + lVar38 * 8;
              lVar88 = 0;
              do {
                dVar129 = 0.0;
                if (*(int *)(lVar63 + lVar88 * 4) == 0) {
                  if (((local_528.arr[0] == Neumann) || (dVar129 = 1.0, local_528.arr[0] == inflow))
                     && (dVar129 = 1.0, (long)bx.smallend.vect[0] + local_498 == lVar88)) {
                    dVar129 = 0.0;
                  }
                  if (((local_538.arr[0] == Neumann) || (dVar134 = 1.0, local_538.arr[0] == inflow))
                     && (dVar134 = 1.0, (long)bx.bigend.vect[0] + local_498 == lVar88)) {
                    dVar134 = 0.0;
                  }
                  if (local_528.arr[1] == Neumann) {
                    dVar126 = 1.0;
                    if (uVar73 == (long)bx.smallend.vect[1]) {
LAB_00658381:
                      dVar126 = 0.0;
                    }
                  }
                  else {
                    dVar126 = 1.0;
                    if (uVar73 == (long)bx.smallend.vect[1] && local_528.arr[1] == inflow)
                    goto LAB_00658381;
                  }
                  if (local_538.arr[1] == Neumann) {
                    dVar131 = 1.0;
                    if (uVar73 == (long)bx.bigend.vect[1]) {
LAB_006583af:
                      dVar131 = 0.0;
                    }
                  }
                  else {
                    dVar131 = 1.0;
                    if (uVar73 == (long)bx.bigend.vect[1] && local_538.arr[1] == inflow)
                    goto LAB_006583af;
                  }
                  if (local_528.arr[2] == Neumann) {
                    dVar119 = 1.0;
                    if (bx.smallend.vect[2] == iVar32) {
LAB_006583d8:
                      dVar119 = 0.0;
                    }
                  }
                  else {
                    dVar119 = 1.0;
                    if (local_528.arr[2] == inflow && bx.smallend.vect[2] == iVar32)
                    goto LAB_006583d8;
                  }
                  dVar132 = 1.0;
                  if (local_538.arr[2] == Neumann) {
                    if (bx.bigend.vect[2] == iVar32) {
LAB_00658409:
                      dVar132 = 0.0;
                    }
                  }
                  else if (local_538.arr[2] == inflow && bx.bigend.vect[2] == iVar32)
                  goto LAB_00658409;
                  lVar80 = (long)(int)(((cccdom_pi.smallend.vect[0] + -1) - local_798) + (int)lVar88
                                      );
                  lVar79 = domain.smallend.vect._0_8_ + (int)(~local_794 + (int)uVar73) * lVar96 * 8
                           + lVar80 * 8;
                  pdVar66 = (double *)(lVar79 + lVar46 * 8);
                  lVar80 = domain.smallend.vect._0_8_ + lVar96 * (uVar73 - (long)(int)local_794) * 8
                           + lVar80 * 8;
                  pdVar86 = (double *)(lVar80 + lVar46 * 8);
                  pdVar85 = (double *)(lVar79 + lVar111 * 8);
                  pdVar1 = (double *)(lVar80 + lVar111 * 8);
                  dVar129 = (dVar134 * *(double *)
                                        (lVar60 + lVar65 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                             dVar131 +
                            dVar129 * pdVar1[lVar76 * 2] * dVar131 +
                            *(double *)(lVar40 + lVar65 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                            dVar134 * dVar126 +
                            pdVar85[lVar76 * 2] * dVar129 * dVar126 +
                            (((-pdVar66[lVar76 * 2] * dVar129 * dVar126 -
                              *(double *)(lVar84 + lVar65 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                              dVar134 * dVar126) - pdVar86[lVar76 * 2] * dVar129 * dVar131) -
                            *(double *)(lVar65 + lVar71 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                            dVar134 * dVar131)) * facz +
                            (*(double *)(lVar60 + lVar41 * -8 + lVar55 + lVar88 * 8) * dVar131 *
                             dVar132 +
                            ((*(double *)(lVar40 + lVar41 * -8 + lVar55 + lVar88 * 8) * dVar126 *
                              dVar132 +
                             ((*(double *)(lVar71 + lVar41 * -8 + lVar55 + lVar88 * 8) * dVar131 *
                               dVar119 +
                              ((*(double *)(lVar84 + lVar41 * -8 + lVar55 + lVar88 * 8) * dVar126 *
                                dVar119 - *pdVar66 * dVar126 * dVar119) -
                              *pdVar86 * dVar131 * dVar119)) - *pdVar85 * dVar126 * dVar132)) -
                            *pdVar1 * dVar131 * dVar132)) * dVar125 +
                            (*(double *)(lVar60 + lVar76 * 8 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                             dVar134 * dVar132 +
                            pdVar1[lVar76] * dVar129 * dVar132 +
                            (((*(double *)(lVar71 + lVar76 * 8 + lVar41 * -8 + lVar55 + lVar88 * 8)
                               * dVar134 * dVar119 +
                              pdVar86[lVar76] * dVar129 * dVar119 +
                              (-pdVar66[lVar76] * dVar129 * dVar119 -
                              *(double *)(lVar84 + lVar76 * 8 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                              dVar134 * dVar119)) - pdVar85[lVar76] * dVar129 * dVar132) -
                            *(double *)(lVar40 + lVar76 * 8 + lVar41 * -8 + lVar55 + lVar88 * 8) *
                            dVar134 * dVar132)) * facy;
                  rhs = local_4f0;
                }
                *(double *)(local_5d8 + lVar88 * 8) = dVar129;
                lVar88 = lVar88 + 1;
              } while ((cccdom_pi.bigend.vect[0] - cccdom_pi.smallend.vect[0]) + 1 != (int)lVar88);
            }
            lVar63 = lVar63 + lVar103;
            iVar42 = iVar42 + 1;
          }
          local_7ec = local_7ec + 1;
        }
      }
      mlndlap_impose_neumann_bc(&cccdom_pi,(Array4<double> *)&mfi_3,&bx,&local_528,&local_538);
      uVar73 = local_5e0;
      if (rhcc.
          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&dlo,
                   &(rhs_cc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_5e0]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                    super_FabArray<amrex::FArrayBox>,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&dhi,
                   &(rhcc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar73]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                    super_FabArray<amrex::FArrayBox>,&mfi);
        iVar37 = cccdom_pi.bigend.vect[1];
        iVar97 = cccdom_pi.bigend.vect[0];
        iVar32 = cccdom_pi.smallend.vect[0];
        iVar42 = cccdom_pi.smallend.vect[1];
        iVar45 = cccdom_pi.bigend.vect[2];
        if (local_400 == covered) {
          lVar107 = (long)cccdom_pi.smallend.vect[0];
          lVar38 = (long)cccdom_pi.smallend.vect[1];
          uVar31 = cccdom_pi.bigend.vect[0] - cccdom_pi.smallend.vect[0];
          for (iVar67 = cccdom_pi.smallend.vect[2]; iVar67 <= iVar45; iVar67 = iVar67 + 1) {
            lVar103 = CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 8;
            pvVar104 = (void *)((lVar38 - local_4c4) * lVar103 +
                                (long)(iVar67 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1])
                                * 8 + (long)local_4c8 * -8 + dlo.vect._0_8_ + lVar107 * 8);
            for (iVar57 = iVar42; iVar57 <= iVar37; iVar57 = iVar57 + 1) {
              if (iVar32 <= iVar97) {
                memset(pvVar104,0,(ulong)uVar31 * 8 + 8);
              }
              pvVar104 = (void *)((long)pvVar104 + lVar103);
            }
          }
        }
        else if (local_400 == singlevalued) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&cell,local_398,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result_1,
                     (FabArray<amrex::FArrayBox> *)
                     this_00.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
          lVar107 = (long)cccdom_pi.smallend.vect[0];
          lVar38 = lVar107 * 8;
          local_5d8 = CONCAT44(local_5d8._4_4_,cccdom_pi.smallend.vect[2] + -1);
          local_5d0 = lVar107 * 4;
          for (lVar103 = (long)cccdom_pi.smallend.vect[2]; (int)lVar103 <= cccdom_pi.bigend.vect[2];
              lVar103 = lVar103 + 1) {
            lVar40 = (long)(int)local_5d8;
            iVar32 = cccdom_pi.smallend.vect[1] + -1;
            for (lVar63 = (long)cccdom_pi.smallend.vect[1]; (int)lVar63 <= cccdom_pi.bigend.vect[1];
                lVar63 = lVar63 + 1) {
              lVar59 = (long)iVar32;
              lVar53 = (long)(int)local_5a8;
              lVar52 = CONCAT44(uStack_5ac,result_1.btype.itype);
              lVar69 = CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 8;
              lVar88 = (lVar63 - local_5a4) * lVar69;
              lVar76 = CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 8;
              lVar79 = (lVar40 - local_5a0) * lVar76;
              lVar96 = lVar88 + lVar79;
              lVar80 = lVar52 * 0x90;
              lVar81 = lVar52 * 0x38;
              lVar64 = lVar52 * 0x30;
              lVar76 = (lVar103 - local_5a0) * lVar76;
              lVar88 = lVar88 + lVar76;
              lVar69 = (lVar59 - local_5a4) * lVar69;
              lVar79 = lVar79 + lVar69;
              lVar69 = lVar69 + lVar76;
              lVar47 = lVar52 * 0x40;
              lVar94 = lVar52 * 0x10;
              lVar54 = result_1.smallend.vect._0_8_ + lVar38;
              lVar76 = lVar80 + lVar96 + lVar53 * -8 + lVar54;
              lVar111 = lVar96 + lVar47 + lVar53 * -8 + lVar54;
              lVar46 = lVar96 + lVar81 + lVar53 * -8 + lVar54;
              lVar41 = lVar96 + lVar64 + lVar53 * -8 + lVar54;
              lVar55 = lVar96 + lVar94 + lVar53 * -8 + lVar54;
              lVar101 = lVar96 + lVar52 * 8 + lVar53 * -8 + lVar54;
              lVar96 = lVar96 + lVar53 * -8 + lVar54;
              lVar60 = lVar88 + lVar80 + lVar53 * -8 + lVar54;
              lVar65 = lVar88 + lVar47 + lVar53 * -8 + lVar54;
              lVar71 = lVar88 + lVar81 + lVar53 * -8 + lVar54;
              lVar110 = lVar88 + lVar64 + lVar53 * -8 + lVar54;
              lVar105 = lVar88 + lVar94 + lVar53 * -8 + lVar54;
              local_608 = (double)(lVar88 + lVar52 * 8 + lVar53 * -8 + lVar54);
              lVar88 = lVar88 + lVar53 * -8 + lVar54;
              lVar92 = lVar79 + lVar80 + lVar53 * -8 + lVar54;
              lVar89 = lVar79 + lVar47 + lVar53 * -8 + lVar54;
              lVar82 = lVar81 + lVar79 + lVar53 * -8 + lVar54;
              lVar77 = lVar64 + lVar79 + lVar53 * -8 + lVar54;
              lVar70 = lVar79 + lVar94 + lVar53 * -8 + lVar54;
              lVar84 = lVar52 * 8 + lVar79 + lVar53 * -8 + lVar54;
              lVar79 = lVar79 + lVar53 * -8 + lVar54;
              lVar80 = lVar80 + lVar69 + lVar53 * -8 + lVar54;
              lVar48 = lVar47 + lVar69 + lVar53 * -8 + lVar54;
              lVar47 = lVar81 + lVar69 + lVar53 * -8 + lVar54;
              local_5f8 = (double)(lVar64 + lVar69 + lVar53 * -8 + lVar54);
              lVar95 = lVar94 + lVar69 + lVar53 * -8 + lVar54;
              lVar52 = lVar69 + lVar52 * 8 + lVar53 * -8 + lVar54;
              lVar54 = lVar69 + lVar53 * -8 + lVar54;
              lVar83 = (lVar40 - (int)local_3d0) * local_3e8 * 8;
              lVar53 = (lVar103 - (int)local_3d0) * local_3e8 * 8;
              lVar81 = CONCAT44(uStack_3ec,dhi.vect[2]) * 8;
              lVar74 = (lVar63 - (int)local_3d4) * lVar81;
              lVar81 = (lVar59 - (int)local_3d4) * lVar81;
              lVar64 = (long)local_3d8;
              lVar69 = dhi.vect._0_8_ + lVar38;
              lVar94 = lVar74 + lVar83 + lVar64 * -8 + lVar69;
              lVar75 = lVar74 + lVar53 + lVar64 * -8 + lVar69;
              lVar83 = lVar83 + lVar81 + lVar64 * -8 + lVar69;
              lVar69 = lVar81 + lVar53 + lVar64 * -8 + lVar69;
              lVar81 = CONCAT44(iStack_36c,local_370) * 8;
              lVar93 = (lVar40 - local_358) * lVar81;
              lVar81 = (lVar103 - local_358) * lVar81;
              lVar53 = CONCAT44(iStack_374,cell.vect[2]) * 8;
              lVar90 = (lVar63 - local_35c) * lVar53;
              lVar53 = (lVar59 - local_35c) * lVar53;
              lVar59 = (long)local_360;
              lVar64 = CONCAT44(cell.vect[1],cell.vect[0]) + lVar38;
              lVar74 = lVar90 + lVar93 + lVar59 * -8 + lVar64;
              lVar90 = lVar90 + lVar81 + lVar59 * -8 + lVar64;
              lVar93 = lVar93 + lVar53 + lVar59 * -8 + lVar64;
              lVar64 = lVar53 + lVar81 + lVar59 * -8 + lVar64;
              for (lVar53 = 0; lVar107 + lVar53 <= (long)cccdom_pi.bigend.vect[0];
                  lVar53 = lVar53 + 1) {
                dVar129 = 0.0;
                if (*(int *)((lVar63 - local_648.begin.y) *
                             CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 4 +
                             (lVar103 - local_648.begin.z) *
                             CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 4 +
                             (long)local_648.begin.x * -4 +
                             CONCAT44(local_648.p._4_4_,(int)local_648.p) + local_5d0 + lVar53 * 4)
                    == 0) {
                  dVar129 = ((*(double *)(lVar77 + -8 + lVar53 * 8) +
                              *(double *)(lVar82 + -8 + lVar53 * 8) +
                             *(double *)(lVar89 + -8 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar93 + -8 + lVar53 * 8) * 0.125 +
                             (*(double *)(lVar79 + -8 + lVar53 * 8) +
                              *(double *)(lVar84 + -8 + lVar53 * 8) +
                             *(double *)(lVar70 + -8 + lVar53 * 8)) * 0.25 +
                            *(double *)(lVar92 + -8 + lVar53 * 8)) *
                            *(double *)(lVar83 + -8 + lVar53 * 8) +
                            ((((-*(double *)(lVar77 + lVar53 * 8) - *(double *)(lVar82 + lVar53 * 8)
                               ) + *(double *)(lVar89 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar93 + lVar53 * 8) * 0.125 +
                             ((*(double *)(lVar84 + lVar53 * 8) - *(double *)(lVar79 + lVar53 * 8))
                             + *(double *)(lVar70 + lVar53 * 8)) * 0.25) -
                            *(double *)(lVar92 + lVar53 * 8)) * *(double *)(lVar83 + lVar53 * 8) +
                            ((((*(double *)(lVar46 + -8 + lVar53 * 8) -
                               *(double *)(lVar41 + -8 + lVar53 * 8)) -
                              *(double *)(lVar111 + -8 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar74 + -8 + lVar53 * 8) * 0.125 +
                             ((*(double *)(lVar96 + -8 + lVar53 * 8) -
                              *(double *)(lVar101 + -8 + lVar53 * 8)) +
                             *(double *)(lVar55 + -8 + lVar53 * 8)) * 0.25) -
                            *(double *)(lVar76 + -8 + lVar53 * 8)) *
                            *(double *)(lVar94 + -8 + lVar53 * 8) +
                            (((*(double *)(lVar41 + lVar53 * 8) - *(double *)(lVar46 + lVar53 * 8))
                             - *(double *)(lVar111 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar74 + lVar53 * 8) * 0.125 +
                             ((-*(double *)(lVar96 + lVar53 * 8) - *(double *)(lVar101 + lVar53 * 8)
                              ) + *(double *)(lVar55 + lVar53 * 8)) * 0.25 +
                            *(double *)(lVar76 + lVar53 * 8)) * *(double *)(lVar94 + lVar53 * 8) +
                            ((((*(double *)((long)local_5f8 + -8 + lVar53 * 8) -
                               *(double *)(lVar47 + -8 + lVar53 * 8)) -
                              *(double *)(lVar48 + -8 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar64 + -8 + lVar53 * 8) * 0.125 +
                             ((*(double *)(lVar54 + -8 + lVar53 * 8) +
                              *(double *)(lVar52 + -8 + lVar53 * 8)) -
                             *(double *)(lVar95 + -8 + lVar53 * 8)) * 0.25) -
                            *(double *)(lVar80 + -8 + lVar53 * 8)) *
                            *(double *)(lVar69 + -8 + lVar53 * 8) +
                            (((*(double *)(lVar47 + lVar53 * 8) -
                              *(double *)((long)local_5f8 + lVar53 * 8)) -
                             *(double *)(lVar48 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar64 + lVar53 * 8) * 0.125 +
                             ((*(double *)(lVar52 + lVar53 * 8) - *(double *)(lVar54 + lVar53 * 8))
                             - *(double *)(lVar95 + lVar53 * 8)) * 0.25 +
                            *(double *)(lVar80 + lVar53 * 8)) * *(double *)(lVar69 + lVar53 * 8) +
                            (((*(double *)(lVar110 + lVar53 * 8) + *(double *)(lVar71 + lVar53 * 8)
                              + *(double *)(lVar65 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar90 + lVar53 * 8) * 0.125 +
                             ((-*(double *)(lVar88 + lVar53 * 8) -
                              *(double *)((long)local_608 + lVar53 * 8)) -
                             *(double *)(lVar105 + lVar53 * 8)) * 0.25) -
                            *(double *)(lVar60 + lVar53 * 8)) * *(double *)(lVar75 + lVar53 * 8) +
                            (((-*(double *)(lVar110 + -8 + lVar53 * 8) -
                              *(double *)(lVar71 + -8 + lVar53 * 8)) +
                             *(double *)(lVar65 + -8 + lVar53 * 8)) * 0.5 +
                             *(double *)(lVar90 + -8 + lVar53 * 8) * 0.125 +
                             ((*(double *)(lVar88 + -8 + lVar53 * 8) -
                              *(double *)((long)local_608 + -8 + lVar53 * 8)) -
                             *(double *)(lVar105 + -8 + lVar53 * 8)) * 0.25 +
                            *(double *)(lVar60 + -8 + lVar53 * 8)) *
                            *(double *)(lVar75 + -8 + lVar53 * 8);
                }
                *(double *)
                 ((lVar63 - local_4c4) * CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 8 +
                  (lVar103 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 8 +
                  (long)local_4c8 * -8 + dlo.vect._0_8_ + lVar38 + lVar53 * 8) = dVar129;
              }
              iVar32 = iVar32 + 1;
            }
            local_5d8 = CONCAT44(local_5d8._4_4_,(int)local_5d8 + 1);
          }
        }
        else {
          lVar107 = (long)cccdom_pi.smallend.vect[1];
          local_608 = (double)CONCAT44(local_608._4_4_,cccdom_pi.bigend.vect[2]);
          lVar38 = (long)cccdom_pi.smallend.vect[0] * 8;
          iVar32 = cccdom_pi.smallend.vect[2] + -1;
          local_5f8 = (double)CONCAT44(local_5f8._4_4_,cccdom_pi.smallend.vect[0] + -1);
          for (lVar103 = (long)cccdom_pi.smallend.vect[2]; iVar42 = (int)lVar103,
              iVar42 <= cccdom_pi.bigend.vect[2]; lVar103 = lVar103 + 1) {
            lVar96 = CONCAT44(aiStack_4dc[0],dlo.vect[2]) * 8;
            lVar76 = (lVar107 - local_4c4) * lVar96 +
                     (lVar103 - local_4c0) * CONCAT44(aiStack_4dc[2],aiStack_4dc[1]) * 8 +
                     (long)local_4c8 * -8 + dlo.vect._0_8_ + lVar38;
            lVar111 = CONCAT44(local_648.jstride._4_4_,(int)local_648.jstride) * 4;
            lVar40 = (lVar107 - local_648.begin.y) * lVar111 +
                     (lVar103 - local_648.begin.z) *
                     CONCAT44(local_648.kstride._4_4_,(int)local_648.kstride) * 4 +
                     (long)local_648.begin.x * -4 +
                     CONCAT44(local_648.p._4_4_,(int)local_648.p) +
                     (long)cccdom_pi.smallend.vect[0] * 4;
            iVar97 = cccdom_pi.smallend.vect[1] + -1;
            for (lVar63 = lVar107; lVar63 <= cccdom_pi.bigend.vect[1]; lVar63 = lVar63 + 1) {
              if (cccdom_pi.smallend.vect[0] <= cccdom_pi.bigend.vect[0]) {
                lVar84 = (long)local_3d8;
                lVar46 = CONCAT44(uStack_3ec,dhi.vect[2]);
                lVar79 = (int)(~local_3d0 + iVar42) * local_3e8;
                lVar41 = (int)(iVar42 - local_3d0) * local_3e8;
                lVar55 = (lVar103 - (int)local_3d0) * local_3e8 * 8;
                lVar80 = (long)(int)(iVar32 - local_3d0) * local_3e8 * 8;
                lVar71 = (long)(int)(iVar97 - local_3d4) * lVar46 * 8;
                lVar60 = lVar46 * 8 * (lVar63 - (int)local_3d4);
                lVar88 = dhi.vect._0_8_ + lVar38;
                lVar65 = 0;
                do {
                  dVar129 = 0.0;
                  if (*(int *)(lVar40 + lVar65 * 4) == 0) {
                    lVar47 = (long)(((cccdom_pi.smallend.vect[0] + -1) - local_3d8) + (int)lVar65);
                    lVar52 = dhi.vect._0_8_ + (int)(~local_3d4 + (int)lVar63) * lVar46 * 8 +
                             lVar47 * 8;
                    lVar47 = dhi.vect._0_8_ + lVar46 * (lVar63 - (int)local_3d4) * 8 + lVar47 * 8;
                    dVar129 = (*(double *)(lVar52 + lVar79 * 8) +
                               *(double *)(lVar71 + lVar80 + lVar84 * -8 + lVar88 + lVar65 * 8) +
                               *(double *)(lVar47 + lVar79 * 8) +
                               *(double *)(lVar60 + lVar80 + lVar84 * -8 + lVar88 + lVar65 * 8) +
                               *(double *)(lVar52 + lVar41 * 8) +
                               *(double *)(lVar55 + lVar71 + lVar84 * -8 + lVar88 + lVar65 * 8) +
                               *(double *)(lVar47 + lVar41 * 8) +
                              *(double *)(lVar55 + lVar60 + lVar84 * -8 + lVar88 + lVar65 * 8)) *
                              0.125;
                  }
                  *(double *)(lVar76 + lVar65 * 8) = dVar129;
                  lVar65 = lVar65 + 1;
                } while ((cccdom_pi.bigend.vect[0] - cccdom_pi.smallend.vect[0]) + 1 != (int)lVar65)
                ;
              }
              lVar76 = lVar76 + lVar96;
              iVar97 = iVar97 + 1;
              lVar40 = lVar40 + lVar111;
            }
            iVar32 = iVar32 + 1;
          }
        }
        mlndlap_impose_neumann_bc(&cccdom_pi,(Array4<double> *)&dlo,&bx,&local_528,&local_538);
        rhs = local_4f0;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    uVar73 = local_5e0 + 1;
  } while( true );
}

Assistant:

void
MLNodeLaplacian::compRHS (const Vector<MultiFab*>& rhs, const Vector<MultiFab*>& vel,
                          const Vector<const MultiFab*>& rhnd,
                          const Vector<MultiFab*>& a_rhcc)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(rhs,vel,rhnd,a_rhcc);
#else
    //
    // Note that div vel we copmute on a coarse/fine nodes is not a
    // composite divergence.  It has been restricted so that it is suitable
    // as RHS for our geometric mulitgrid solver with a MG hirerachy
    // including multiple AMR levels.
    //
    // Also note that even for RAP, we do doubling at Nuemann boundary,
    // because unimposeNeumannBC will be called on rhs for RAP.
    //

    BL_PROFILE("MLNodeLaplacian::compRHS()");

    if (!m_masks_built) buildMasks();

#ifdef AMREX_USE_EB
    if (!m_integral_built) buildIntegral();
    if (m_build_surface_integral && !m_surface_integral_built) buildSurfaceIntegral();
#endif

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool has_inflow = false;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        has_inflow = has_inflow || (lobc[idim] == LinOpBCType::inflow ||
                                    hibc[idim] == LinOpBCType::inflow);
    }

    Vector<std::unique_ptr<MultiFab> > rhcc(m_num_amr_levels);
    Vector<std::unique_ptr<MultiFab> > rhs_cc(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        const Geometry& geom = m_geom[ilev][0];
        AMREX_ASSERT(vel[ilev]->nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(vel[ilev]->nGrow() >= 1);

        if (has_inflow) { // Zero out transverse velocity so that it's not seen.
            Box domain = geom.Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (lobc[idim] != LinOpBCType::inflow) {
                    domain.growLo(idim,1);
                }
                if (hibc[idim] != LinOpBCType::inflow) {
                    domain.growHi(idim,1);
                }
            }
            const auto dlo = domain.smallEnd();
            const auto dhi = domain.bigEnd();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*vel[ilev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(1);
                Array4<Real> const& vfab = vel[ilev]->array(mfi);
                if ( ! domain.contains(bx) ) {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        IntVect cell(AMREX_D_DECL(i,j,k));
                        for (int in = 0; in < AMREX_SPACEDIM; ++in) {
                            for (int it = 0; it < AMREX_SPACEDIM; ++it) {
                                if (it != in) {
                                    if (cell[in] < dlo[in] || cell[in] > dhi[in]) {
                                        vfab(i,j,k,it) = Real(0.0);
                                    }
                                }
                            }
                        }
                    });
                }
            }
        }

        vel[ilev]->FillBoundary(0, AMREX_SPACEDIM, IntVect(1), geom.periodicity());

        if (ilev < a_rhcc.size() && a_rhcc[ilev])
        {
            rhcc[ilev] = std::make_unique<MultiFab>(a_rhcc[ilev]->boxArray(),
                                                    a_rhcc[ilev]->DistributionMap(), 1, 1);
            rhcc[ilev]->setVal(0.0);
            MultiFab::Copy(*rhcc[ilev], *a_rhcc[ilev], 0, 0, 1, 0);
            rhcc[ilev]->FillBoundary(geom.periodicity());

            rhs_cc[ilev] = std::make_unique<MultiFab>(rhs[ilev]->boxArray(),
                                                      rhs[ilev]->DistributionMap(), 1, 0);
        }

        const auto dxinvarr = geom.InvCellSizeArray();
        const Box& nddom = amrex::surroundingNodes(geom.Domain());

        const iMultiFab& dmsk = *m_dirichlet_mask[ilev][0];

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[ilev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
        const MultiFab* intg = m_integral[ilev].get();
        const MultiFab* sintg = m_surface_integral[ilev].get();

        AMREX_ALWAYS_ASSERT(ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2
                            || factory == nullptr || factory->isAllRegular());
#endif

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
            bool regular = !factory;
            FabType typ = FabType::regular;
            if (factory)
            {
                const auto& flag = (*flags)[mfi];
                const auto& ccbx = amrex::grow(amrex::enclosedCells(bx),1);
                typ = flag.getType(ccbx);
                if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhsarr(i,j,k) = 0.0;
                    });
                }
                else if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,velarr,vfracarr,intgarr,dmskarr,dxinvarr,nddom,lobc,hibc);
                    });

                    if (m_eb_vel_dot_n[ilev]) {
                        Array4<Real const> const& eb_vel_dot_n = m_eb_vel_dot_n[ilev]->const_array(mfi);
                        Array4<Real const> const& bareaarr = barea->const_array(mfi);
                        Array4<Real const> const& sintgarr = sintg->const_array(mfi);

                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            add_eb_flow_contribution(i,j,k,rhsarr,dmskarr,
                                dxinvarr,bareaarr,sintgarr,eb_vel_dot_n);
                        });
                    }
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc,is_rz);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc);
                });
#endif
            }

            mlndlap_impose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);

            if (rhcc[ilev])
            {
                Array4<Real> const& rhs_cc_a = rhs_cc[ilev]->array(mfi);
                Array4<Real const> const& rhccarr = rhcc[ilev]->const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                    });
                }
                else if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = 0.0;
                    });
                }
                else
#endif
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc(i, j, k, rhccarr, dmskarr);
                    });
                }

                mlndlap_impose_neumann_bc(bx, rhs_cc_a, nddom, lobc, hibc);
            }
        }
    }

    Vector<std::unique_ptr<MultiFab> > frhs(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels-1; ++ilev)
    {
        const int amrrr = AMRRefRatio(ilev);
        const Geometry& fgeom = m_geom[ilev+1][0];
        AMREX_ALWAYS_ASSERT(amrrr == 2 || amrrr == 4);

        frhs[ilev] = std::make_unique<MultiFab>(amrex::coarsen(rhs[ilev+1]->boxArray(),amrrr),
                                                rhs[ilev+1]->DistributionMap(), 1, 0);

        const Box& ccfdom = fgeom.Domain();
        const auto fdxinv = fgeom.InvCellSizeArray();
        const iMultiFab& fdmsk = *m_dirichlet_mask[ilev+1][0];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*frhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& cbx = mfi.tilebox();
            const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
            const Box& cc_fvbx = amrex::enclosedCells(fvbx);

            Box bx_vel = cc_fvbx;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (m_lobc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.smallEnd(idim) == ccfdom.smallEnd(idim)) {
                        bx_vel.growLo(idim, 1);
                    }
                }
                if (m_hibc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.bigEnd(idim) == ccfdom.bigEnd(idim)) {
                        bx_vel.growHi(idim, 1);
                    }
                }
            }

            Array4<Real> const& rhsarr = frhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev+1]->const_array(mfi);
            Array4<Real const> const& rhsarr_fine = rhs[ilev+1]->const_array(mfi);
            Array4<int const> const& mskarr = fdmsk.const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            }
#endif

            if (rhcc[ilev+1])
            {
                // xxxxx TODO: incorrect if cut cells are too close to coarse/fine boundary
                Array4<Real const> const& rhccarr = rhcc[ilev+1]->const_array(mfi);
                if (amrrr == 2) {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<2>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                } else {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<4>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                }
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (rhs_cc[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhs_cc[ilev], 0, 0, 1, 0);
        }
    }

    for (int ilev = m_num_amr_levels-2; ilev >= 0; --ilev)
    {
        const Geometry& cgeom = m_geom[ilev][0];

        MultiFab crhs(rhs[ilev]->boxArray(), rhs[ilev]->DistributionMap(), 1, 0);
        crhs.setVal(0.0);
        crhs.ParallelAdd(*frhs[ilev], cgeom.periodicity());

        const Box& cccdom = cgeom.Domain();
        const Box& cccdom_p = cgeom.growPeriodicDomain(1);
        Box cccdom_pi = cccdom_p;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (lobc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growLo(idim,1);
            }
            if (hibc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growHi(idim,1);
            }
        }
        const Box& cnddom = amrex::surroundingNodes(cccdom);
        const auto cdxinv = cgeom.InvCellSizeArray();
        const iMultiFab& cdmsk = *m_dirichlet_mask[ilev][0];
        const iMultiFab& c_nd_mask = *m_nd_fine_mask[ilev];
        const iMultiFab& c_cc_mask = *m_cc_fine_mask[ilev];
        const auto& has_fine_bndry = *m_has_fine_bndry[ilev];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            if (has_fine_bndry[mfi])
            {
                const Box& bx = mfi.tilebox();

                Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
                Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
                Array4<Real const> const& crhsarr = crhs.const_array(mfi);
                Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
                Array4<int const> const& ndmskarr = c_nd_mask.const_array(mfi);
                Array4<int const> const& ccmskarr = c_cc_mask.const_array(mfi);

                Array4<Real const> rhccarr = (rhcc[ilev])
                    ? rhcc[ilev]->const_array(mfi) : Array4<Real const>{};
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            is_rz,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#endif
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (ilev < rhnd.size() && rhnd[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhnd[ilev], 0, 0, 1, 0);
        }
    }

#ifdef AMREX_USE_EB
    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev) {
        amrex::EB_set_covered(*rhs[ilev], 0.0);
    }
#endif
#endif
}